

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  stbtt__point sVar6;
  stbtt__point sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  stbtt_uint8 sVar11;
  byte bVar12;
  byte bVar13;
  ImWchar IVar14;
  ImFont *pIVar15;
  ImFont **ppIVar16;
  stbtt_uint8 *data;
  void *pvVar17;
  undefined8 *puVar18;
  ImFontConfig *pIVar19;
  long lVar20;
  char cVar21;
  char cVar27;
  short sVar35;
  stbrp_node *psVar36;
  undefined1 auVar37 [16];
  stbtt__buf fontdict;
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  unkuint10 Var40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  unkbyte10 Var43;
  undefined1 auVar44 [13];
  undefined1 auVar45 [11];
  undefined1 auVar46 [14];
  undefined1 auVar47 [15];
  undefined1 auVar48 [14];
  undefined1 auVar49 [16];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  uint6 uVar55;
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  ushort uVar58;
  short sVar59;
  stbtt_uint32 sVar60;
  uint uVar67;
  int iVar68;
  stbtt__active_edge *z;
  stbtt_uint32 sVar61;
  stbtt_uint32 sVar62;
  stbtt_uint32 sVar63;
  stbtt_uint32 sVar64;
  stbtt_uint32 sVar65;
  stbtt_uint32 sVar66;
  void *__dest;
  void *pvVar69;
  ulong uVar70;
  int *piVar71;
  void *pvVar72;
  stbrp_context *ptr;
  uchar *puVar73;
  stbtt__point *points;
  stbtt__edge *psVar74;
  stbtt__buf *scanline;
  stbtt__buf *psVar75;
  undefined8 *puVar76;
  stbtt__active_edge *psVar77;
  stbtt__active_edge *psVar78;
  int iVar79;
  long lVar80;
  ImWchar *pIVar81;
  uint *puVar82;
  stbtt__active_edge *psVar83;
  stbtt__active_edge *psVar84;
  int mask;
  long lVar85;
  ulong uVar86;
  stbtt_fontinfo *psVar87;
  byte *pbVar88;
  int bit_n;
  uchar uVar89;
  int output_i;
  ulong uVar90;
  stbtt__edge *psVar91;
  ulong uVar92;
  size_t size;
  byte *pbVar93;
  ImFontConfig *pIVar94;
  int iVar95;
  int iVar96;
  long lVar97;
  int iVar98;
  void *p;
  ushort *puVar99;
  uint uVar100;
  long lVar101;
  bool bVar102;
  byte bVar103;
  float fVar104;
  byte bVar113;
  char cVar114;
  short sVar116;
  ushort uVar117;
  undefined1 auVar105 [16];
  char cVar115;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar118;
  uint uVar122;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  uint uVar123;
  uint uVar124;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar125 [16];
  uint uVar129;
  uint uVar130;
  uint uVar131;
  undefined1 in_XMM3 [16];
  uint uVar132;
  uint uVar133;
  uint uVar135;
  uint uVar136;
  undefined1 auVar134 [16];
  uint uVar137;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  undefined4 uVar150;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar155 [16];
  float fVar160;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined4 uVar168;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  stbtt__buf sVar183;
  float y0_2;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  stbtt_uint32 charstrings;
  int y1;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  stbtt_uint32 fdarrayoff;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  int iVar184;
  undefined1 local_4c8 [16];
  int iVar185;
  stbtt__active_edge local_480;
  long local_460;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined8 local_438;
  void *pvStack_430;
  undefined8 local_428;
  int local_420;
  int local_41c;
  undefined8 local_418;
  void *pvStack_410;
  stbrp_node *local_408;
  float local_400;
  uint local_3fc;
  void *local_3f8;
  ulong local_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d8;
  undefined8 *local_3d0;
  float local_3c4;
  ulong local_3c0;
  uchar *local_3b8;
  uchar *local_3b0;
  long local_3a8;
  stbtt__point *local_3a0;
  ulong local_398;
  float *local_390;
  uint local_384;
  uint local_380;
  float local_37c;
  float local_378;
  int local_374;
  int local_370;
  int local_36c;
  stbrp_context *local_368;
  long local_360;
  stbtt_fontinfo *local_358;
  ulong local_350;
  float *local_348;
  ulong local_340;
  ulong local_338;
  stbtt__edge *local_330;
  float local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  float local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  ImFontConfig *local_300;
  long local_2f8;
  undefined4 *local_2f0;
  long local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  ulong local_2d0;
  long local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  ulong local_298;
  undefined8 uStack_290;
  stbtt__buf local_288 [33];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  undefined1 auVar106 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined6 uVar151;
  undefined8 uVar152;
  undefined1 auVar153 [12];
  undefined1 auVar154 [14];
  undefined1 auVar156 [16];
  undefined6 uVar169;
  undefined8 uVar170;
  undefined1 auVar171 [12];
  undefined1 auVar172 [14];
  undefined1 auVar176 [16];
  
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  iVar98 = 0;
  pvVar69 = (void *)0x0;
  local_438 = 0;
  pvStack_430 = (void *)0x0;
  iVar185 = (atlas->ConfigData).Size;
  iVar68 = 0;
  __dest = pvVar69;
  if (0 < iVar185) {
    iVar184 = 8;
    if (7 < iVar185) {
      iVar184 = iVar185;
    }
    if ((0 < iVar184) &&
       (__dest = ImGui::MemAlloc((long)iVar184 * 0x110), iVar68 = iVar184, pvVar69 != (void *)0x0))
    {
      memcpy(__dest,pvVar69,(long)iVar98 * 0x110);
      ImGui::MemFree(pvVar69);
    }
  }
  uVar67 = (atlas->Fonts).Size;
  if (local_438._4_4_ < (int)uVar67) {
    if (local_438._4_4_ == 0) {
      uVar100 = 8;
    }
    else {
      uVar100 = local_438._4_4_ / 2 + local_438._4_4_;
    }
    if ((int)uVar100 <= (int)uVar67) {
      uVar100 = uVar67;
    }
    if (local_438._4_4_ < (int)uVar100) {
      pvVar69 = ImGui::MemAlloc((long)(int)uVar100 << 5);
      if (pvStack_430 != (void *)0x0) {
        memcpy(pvVar69,pvStack_430,(long)(int)local_438 << 5);
        ImGui::MemFree(pvStack_430);
      }
      local_438 = (ulong)uVar100 << 0x20;
      pvStack_430 = pvVar69;
    }
  }
  local_438 = CONCAT44(local_438._4_4_,uVar67);
  memset(__dest,0,(long)iVar185 * 0x110);
  memset(pvStack_430,0,(long)(int)local_438 << 5);
  iVar98 = (atlas->ConfigData).Size;
  iVar184 = CONCAT13(iVar98 < 1,(int3)in_stack_fffffffffffffb2c);
  if (0 < iVar98) {
    lVar97 = 0;
    pvVar69 = __dest;
    do {
      pIVar94 = (atlas->ConfigData).Data + lVar97;
      lVar80 = lVar97 * 0x110;
      *(undefined4 *)((long)pvVar69 + lVar80 + 0xe0) = 0xffffffff;
      uVar70 = (ulong)(atlas->Fonts).Size;
      __dest = pvVar69;
      if ((long)uVar70 < 1) goto LAB_0013db93;
      pIVar15 = pIVar94->DstFont;
      ppIVar16 = (atlas->Fonts).Data;
      uVar92 = 0xffffffff;
      uVar90 = 0;
      do {
        if (pIVar15 == ppIVar16[uVar90]) {
          *(int *)((long)pvVar69 + lVar80 + 0xe0) = (int)uVar90;
          uVar92 = uVar90 & 0xffffffff;
        }
        uVar90 = uVar90 + 1;
      } while ((uVar90 < uVar70) && ((int)uVar92 == -1));
      if ((int)uVar92 == -1) goto LAB_0013db93;
      local_3e8._0_8_ = lVar97;
      data = (stbtt_uint8 *)pIVar94->FontData;
      iVar98 = pIVar94->FontNo;
      sVar11 = *data;
      local_448._0_8_ = pIVar94;
      if (((((sVar11 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar11 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_0013aa61:
        uVar67 = -(uint)(iVar98 != 0);
LAB_0013aa6a:
        local_4c8._0_4_ = uVar67;
      }
      else {
        if (sVar11 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0013aa37;
          goto LAB_0013aa61;
        }
        if ((((sVar11 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_0013aa61;
LAB_0013aa37:
        local_4c8._0_4_ = 0xffffffff;
        if (sVar11 == 't') {
          if (data[1] != 't') {
            if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_0013aa61;
            goto LAB_0013aaac;
          }
          if ((data[2] != 'c') || (data[3] != 'f')) goto LAB_0013aaac;
          uVar67 = *(uint *)(data + 4);
          uVar67 = uVar67 >> 0x18 | (uVar67 & 0xff0000) >> 8 | (uVar67 & 0xff00) << 8 |
                   uVar67 << 0x18;
          if (((uVar67 != 0x20000) && (uVar67 != 0x10000)) ||
             (uVar67 = *(uint *)(data + 8),
             (int)(uVar67 >> 0x18 | (uVar67 & 0xff0000) >> 8 | (uVar67 & 0xff00) << 8 |
                  uVar67 << 0x18) <= iVar98)) goto LAB_0013aaac;
          uVar67 = *(uint *)(data + (long)iVar98 * 4 + 0xc);
          uVar67 = uVar67 >> 0x18 | (uVar67 & 0xff0000) >> 8 | (uVar67 & 0xff00) << 8 |
                   uVar67 << 0x18;
          goto LAB_0013aa6a;
        }
      }
LAB_0013aaac:
      *(stbtt_uint8 **)((long)pvVar69 + lVar80 + 8) = data;
      *(undefined4 *)((long)pvVar69 + lVar80 + 0x10) = local_4c8._0_4_;
      *(undefined8 *)((long)pvVar69 + lVar80 + 0x40) = 0;
      *(undefined8 *)((long)pvVar69 + lVar80 + 0x48) = 0;
      sVar60 = stbtt__find_table(data,local_4c8._0_4_,"cmap");
      sVar61 = stbtt__find_table(data,local_4c8._0_4_,"loca");
      *(stbtt_uint32 *)((long)pvVar69 + lVar80 + 0x18) = sVar61;
      sVar62 = stbtt__find_table(data,local_4c8._0_4_,"head");
      *(stbtt_uint32 *)((long)pvVar69 + lVar80 + 0x1c) = sVar62;
      sVar63 = stbtt__find_table(data,local_4c8._0_4_,"glyf");
      *(stbtt_uint32 *)((long)pvVar69 + lVar80 + 0x20) = sVar63;
      sVar64 = stbtt__find_table(data,local_4c8._0_4_,"hhea");
      *(stbtt_uint32 *)((long)pvVar69 + lVar80 + 0x24) = sVar64;
      sVar65 = stbtt__find_table(data,local_4c8._0_4_,"hmtx");
      *(stbtt_uint32 *)((long)pvVar69 + lVar80 + 0x28) = sVar65;
      sVar66 = stbtt__find_table(data,local_4c8._0_4_,"kern");
      *(stbtt_uint32 *)((long)pvVar69 + lVar80 + 0x2c) = sVar66;
      sVar66 = stbtt__find_table(data,local_4c8._0_4_,"GPOS");
      *(stbtt_uint32 *)((long)pvVar69 + lVar80 + 0x30) = sVar66;
      if ((((sVar60 == 0) || (sVar62 == 0)) || (sVar64 == 0)) || (sVar65 == 0)) goto LAB_0013db93;
      if (sVar63 == 0) {
        local_418 = CONCAT44(local_418._4_4_,2);
        local_480.next = (stbtt__active_edge *)((ulong)local_480.next & 0xffffffff00000000);
        local_428._0_4_ = 0;
        local_480.fdx = 0.0;
        sVar63 = stbtt__find_table(data,local_4c8._0_4_,"CFF ");
        if (sVar63 == 0) goto LAB_0013db93;
        *(undefined8 *)((long)pvVar69 + lVar80 + 0x90) = 0;
        *(undefined8 *)((long)pvVar69 + lVar80 + 0x98) = 0;
        *(undefined8 *)((long)pvVar69 + lVar80 + 0x80) = 0;
        *(undefined8 *)((long)pvVar69 + lVar80 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvVar69 + lVar80 + 0x40) = data + sVar63;
        *(undefined8 *)((long)pvVar69 + lVar80 + 0x48) = 0x2000000000000000;
        local_288[0].data = *(uchar **)((long)pvVar69 + lVar80 + 0x40);
        uVar152 = *(undefined8 *)((long)pvVar69 + lVar80 + 0x48);
        local_288[0].cursor = (int)uVar152;
        local_288[0].size = (int)((ulong)uVar152 >> 0x20);
        uVar67 = local_288[0].cursor + 2U;
        if (local_288[0].size < (int)(local_288[0].cursor + 2U)) {
          uVar67 = local_288[0].size;
        }
        if (local_288[0].cursor < -2) {
          uVar67 = local_288[0].size;
        }
        local_288[0].cursor = 0;
        if ((int)uVar67 < local_288[0].size) {
          local_288[0].cursor = (int)local_288[0].data[(int)uVar67];
        }
        if (local_288[0].size < local_288[0].cursor) {
          local_288[0].cursor = local_288[0].size;
        }
        stbtt__cff_get_index(local_288);
        sVar183 = stbtt__cff_get_index(local_288);
        local_458 = (undefined1  [16])stbtt__cff_index_get(sVar183,0);
        stbtt__cff_get_index(local_288);
        sVar183 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvVar69 + lVar80 + 0x60) = sVar183;
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x11,1,(stbtt_uint32 *)&local_480);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x106,1,(stbtt_uint32 *)&local_418);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x124,1,(stbtt_uint32 *)&local_428);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x125,1,(stbtt_uint32 *)&local_480.fdx);
        sVar183.data._4_4_ = sVar61;
        sVar183.data._0_4_ = in_stack_fffffffffffffb20;
        sVar183.cursor = in_stack_fffffffffffffb28;
        sVar183.size = iVar184;
        fontdict.data._4_4_ = iVar68;
        fontdict.data._0_4_ = iVar185;
        fontdict._8_8_ = __dest;
        sVar183 = stbtt__get_subrs(sVar183,fontdict);
        fVar118 = local_480.fdx;
        *(stbtt__buf *)((long)pvVar69 + lVar80 + 0x70) = sVar183;
        if (((stbtt_uint32)local_418 != 2) ||
           (iVar98 = (int)local_480.next, (int)local_480.next == 0)) goto LAB_0013db93;
        if ((stbtt_uint32)local_428 != 0) {
          uVar70 = (ulong)(uint)local_480.fdx;
          if (uVar70 == 0) goto LAB_0013db93;
          local_288[0].cursor = (stbtt_uint32)local_428;
          if (local_288[0].size < (int)(stbtt_uint32)local_428) {
            local_288[0].cursor = local_288[0].size;
          }
          if ((int)(stbtt_uint32)local_428 < 0) {
            local_288[0].cursor = local_288[0].size;
          }
          sVar183 = stbtt__cff_get_index(local_288);
          *(stbtt__buf *)((long)pvVar69 + lVar80 + 0x80) = sVar183;
          puVar73 = local_288[0].data + uVar70;
          lVar97 = (ulong)(uint)(local_288[0].size - (int)fVar118) << 0x20;
          if ((int)(local_288[0].size - (int)fVar118 | (uint)fVar118) < 0 ||
              local_288[0].size < (int)fVar118) {
            puVar73 = (uchar *)0x0;
            lVar97 = 0;
          }
          *(uchar **)((long)pvVar69 + lVar80 + 0x90) = puVar73;
          *(long *)((long)pvVar69 + lVar80 + 0x98) = lVar97;
        }
        local_288[0].cursor = iVar98;
        if (local_288[0].size < iVar98) {
          local_288[0].cursor = local_288[0].size;
        }
        if (iVar98 < 0) {
          local_288[0].cursor = local_288[0].size;
        }
        sVar183 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvVar69 + lVar80 + 0x50) = sVar183;
      }
      else if (sVar61 == 0) goto LAB_0013db93;
      sVar61 = stbtt__find_table(data,local_4c8._0_4_,"maxp");
      if (sVar61 == 0) {
        uVar67 = 0xffff;
      }
      else {
        uVar67 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar61 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar61 + 4) >> 8);
      }
      *(uint *)((long)pvVar69 + lVar80 + 0x14) = uVar67;
      uVar58 = *(ushort *)(data + (ulong)sVar60 + 2) << 8 |
               *(ushort *)(data + (ulong)sVar60 + 2) >> 8;
      *(undefined4 *)((long)pvVar69 + lVar80 + 0x34) = 0;
      if (uVar58 != 0) {
        uVar67 = sVar60 + 4;
        uVar70 = (ulong)uVar58;
        do {
          uVar58 = *(ushort *)(data + uVar67) << 8 | *(ushort *)(data + uVar67) >> 8;
          if ((uVar58 == 0) ||
             ((uVar58 == 3 &&
              ((uVar58 = *(ushort *)(data + (ulong)uVar67 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar67 + 2) >> 8, uVar58 == 10 || (uVar58 == 1)))
              ))) {
            uVar100 = *(uint *)(data + (ulong)uVar67 + 4);
            *(uint *)((long)pvVar69 + lVar80 + 0x34) =
                 (uVar100 >> 0x18 | (uVar100 & 0xff0000) >> 8 | (uVar100 & 0xff00) << 8 |
                 uVar100 << 0x18) + sVar60;
          }
          uVar67 = uVar67 + 8;
          uVar70 = uVar70 - 1;
        } while (uVar70 != 0);
      }
      if (*(int *)((long)pvVar69 + lVar80 + 0x34) == 0) goto LAB_0013db93;
      *(uint *)((long)pvVar69 + lVar80 + 0x38) =
           (uint)(ushort)(*(ushort *)(data + (long)(int)sVar62 + 0x32) << 8 |
                         *(ushort *)(data + (long)(int)sVar62 + 0x32) >> 8);
      piVar71 = (int *)((long)*(int *)((long)pvVar69 + lVar80 + 0xe0) * 0x20 + (long)pvStack_430);
      pIVar81 = *(ImWchar **)(local_448._0_8_ + 0x38);
      if (pIVar81 == (ImWchar *)0x0) {
        pIVar81 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar69 + lVar80 + 0xd8) = pIVar81;
      IVar14 = *pIVar81;
      while (IVar14 != 0) {
        uVar58 = pIVar81[1];
        if (uVar58 == 0) break;
        uVar67 = *(uint *)((long)pvVar69 + lVar80 + 0xe4);
        uVar100 = (uint)uVar58;
        if ((int)(uint)uVar58 < (int)uVar67) {
          uVar100 = uVar67;
        }
        *(uint *)((long)pvVar69 + lVar80 + 0xe4) = uVar100;
        IVar14 = pIVar81[2];
        pIVar81 = pIVar81 + 2;
      }
      *piVar71 = *piVar71 + 1;
      iVar98 = *(int *)((long)pvVar69 + lVar80 + 0xe4);
      if (iVar98 < piVar71[1]) {
        iVar98 = piVar71[1];
      }
      piVar71[1] = iVar98;
      lVar97 = local_3e8._0_8_ + 1;
      lVar80 = (long)(atlas->ConfigData).Size;
      iVar184 = CONCAT13(lVar80 <= lVar97,(int3)iVar184);
      pvVar69 = __dest;
    } while (lVar97 < lVar80);
  }
  uVar152 = local_4c8._8_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = local_4c8._8_8_;
  local_4c8 = auVar119 << 0x40;
  if (0 < iVar185) {
    lVar97 = 0;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar152;
    local_4c8 = auVar121 << 0x40;
    pvVar69 = __dest;
    do {
      lVar80 = lVar97 * 0x110;
      piVar71 = (int *)((long)*(int *)((long)pvVar69 + lVar80 + 0xe0) * 0x20 + (long)pvStack_430);
      pIVar94 = (atlas->ConfigData).Data;
      __dest = pvVar69;
      ImBoolVector::Resize
                ((ImBoolVector *)((long)pvVar69 + lVar80 + 0xf0),
                 *(int *)((long)pvVar69 + lVar80 + 0xe4) + 1);
      if ((1 < *piVar71) && (piVar71[4] == 0)) {
        ImBoolVector::Resize((ImBoolVector *)(piVar71 + 4),piVar71[1] + 1);
      }
      psVar87 = (stbtt_fontinfo *)((long)pvVar69 + lVar80);
      puVar99 = *(ushort **)&psVar87[1].indexToLocFormat;
      uVar58 = *puVar99;
      if (uVar58 != 0) {
        do {
          uVar117 = puVar99[1];
          if (uVar117 == 0) break;
          if (uVar58 <= uVar117) {
            uVar67 = (uint)uVar58;
            bVar102 = pIVar94[lVar97].MergeMode;
            do {
              auVar119 = local_4c8;
              if (((bVar102 == false) ||
                  ((*(uint *)(*(long *)(piVar71 + 6) + (ulong)(uVar67 >> 5) * 4) >> (uVar67 & 0x1f)
                   & 1) == 0)) && (iVar68 = stbtt_FindGlyphIndex(psVar87,uVar67), iVar68 != 0)) {
                piVar1 = &psVar87[1].cff.cursor;
                *piVar1 = *piVar1 + 1;
                piVar71[2] = piVar71[2] + 1;
                uVar100 = 1 << ((byte)uVar67 & 0x1f);
                puVar2 = (uint *)(*(long *)&psVar87[1].charstrings.cursor + (ulong)(uVar67 >> 5) * 4
                                 );
                *puVar2 = *puVar2 | uVar100;
                if (1 < *piVar71) {
                  puVar2 = (uint *)(*(long *)(piVar71 + 6) + (ulong)(uVar67 >> 5) * 4);
                  *puVar2 = *puVar2 | uVar100;
                }
                iVar68 = local_4c8._0_4_;
                local_4c8._4_4_ = 0;
                local_4c8._0_4_ = iVar68 + 1;
                local_4c8._8_8_ = auVar119._8_8_;
              }
              uVar67 = uVar67 + 1;
            } while (uVar117 + 1 != uVar67);
          }
          uVar58 = puVar99[2];
          puVar99 = puVar99 + 2;
        } while (uVar58 != 0);
      }
      lVar97 = lVar97 + 1;
      pvVar69 = __dest;
    } while (lVar97 < iVar185);
  }
  if (0 < iVar185) {
    lVar97 = 0;
    pvVar69 = __dest;
    do {
      lVar80 = lVar97 * 0x110;
      iVar68 = *(int *)((long)pvVar69 + lVar80 + 0xe8);
      __dest = pvVar69;
      if (*(int *)((long)pvVar69 + lVar80 + 0x104) < iVar68) {
        pvVar72 = ImGui::MemAlloc((long)iVar68 << 2);
        pvVar17 = *(void **)((long)pvVar69 + lVar80 + 0x108);
        if (pvVar17 != (void *)0x0) {
          memcpy(pvVar72,pvVar17,(long)*(int *)((long)pvVar69 + lVar80 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar69 + lVar80 + 0x108));
        }
        *(void **)((long)pvVar69 + lVar80 + 0x108) = pvVar72;
        *(int *)((long)pvVar69 + lVar80 + 0x104) = iVar68;
      }
      local_448._0_8_ = lVar97;
      lVar97 = (long)*(int *)((long)pvVar69 + lVar80 + 0xf0);
      if (0 < lVar97) {
        puVar82 = *(uint **)((long)pvVar69 + lVar80 + 0xf8);
        puVar2 = puVar82 + lVar97;
        iVar68 = 0;
        do {
          uVar67 = *puVar82;
          if (uVar67 != 0) {
            uVar100 = 0;
            do {
              if ((uVar67 >> (uVar100 & 0x1f) & 1) != 0) {
                iVar98 = *(int *)((long)pvVar69 + lVar80 + 0x100);
                iVar96 = *(int *)((long)pvVar69 + lVar80 + 0x104);
                if (iVar98 == iVar96) {
                  if (iVar96 == 0) {
                    iVar79 = 8;
                  }
                  else {
                    iVar79 = iVar96 / 2 + iVar96;
                  }
                  iVar98 = iVar98 + 1;
                  if (iVar98 < iVar79) {
                    iVar98 = iVar79;
                  }
                  if (iVar96 < iVar98) {
                    pvVar72 = ImGui::MemAlloc((long)iVar98 << 2);
                    pvVar17 = *(void **)((long)pvVar69 + lVar80 + 0x108);
                    if (pvVar17 != (void *)0x0) {
                      memcpy(pvVar72,pvVar17,(long)*(int *)((long)pvVar69 + lVar80 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar69 + lVar80 + 0x108));
                    }
                    *(void **)((long)pvVar69 + lVar80 + 0x108) = pvVar72;
                    *(int *)((long)pvVar69 + lVar80 + 0x104) = iVar98;
                  }
                }
                *(uint *)(*(long *)((long)pvVar69 + lVar80 + 0x108) +
                         (long)*(int *)((long)pvVar69 + lVar80 + 0x100) * 4) = iVar68 + uVar100;
                piVar71 = (int *)((long)pvVar69 + lVar80 + 0x100);
                *piVar71 = *piVar71 + 1;
              }
              uVar100 = uVar100 + 1;
            } while (uVar100 != 0x20);
          }
          puVar82 = puVar82 + 1;
          iVar68 = iVar68 + 0x20;
        } while (puVar82 < puVar2);
      }
      pvVar17 = *(void **)((long)pvVar69 + lVar80 + 0xf8);
      uVar152 = local_448._0_8_;
      if (pvVar17 != (void *)0x0) {
        *(undefined8 *)((long)pvVar69 + lVar80 + 0xf0) = 0;
        ImGui::MemFree(pvVar17);
        *(undefined8 *)((long)pvVar69 + lVar80 + 0xf8) = 0;
      }
      lVar97 = uVar152 + 1;
      pvVar69 = __dest;
    } while (lVar97 < iVar185);
  }
  uVar67 = local_4c8._0_4_;
  if (0 < (int)local_438) {
    lVar97 = 0x18;
    lVar80 = 0;
    do {
      pvVar69 = pvStack_430;
      if (*(void **)((long)pvStack_430 + lVar97) != (void *)0x0) {
        *(undefined8 *)((long)pvStack_430 + lVar97 + -8) = 0;
        ImGui::MemFree(*(void **)((long)pvStack_430 + lVar97));
        *(undefined8 *)((long)pvVar69 + lVar97) = 0;
      }
      lVar80 = lVar80 + 1;
      lVar97 = lVar97 + 0x20;
    } while (lVar80 < (int)local_438);
  }
  if (pvStack_430 != (void *)0x0) {
    local_438 = 0;
    ImGui::MemFree(pvStack_430);
    pvStack_430 = (void *)0x0;
  }
  local_458 = ZEXT816(0);
  local_418 = 0;
  pvStack_410 = (void *)0x0;
  if (0 < (int)uVar67) {
    uVar100 = 8;
    if (7 < (int)uVar67) {
      uVar100 = uVar67;
    }
    if (0 < (int)uVar100) {
      pvVar69 = ImGui::MemAlloc((long)(int)uVar100 << 4);
      if ((void *)local_458._8_8_ != (void *)0x0) {
        memcpy(pvVar69,(void *)local_458._8_8_,(long)(int)local_458._0_4_ << 4);
        ImGui::MemFree((void *)local_458._8_8_);
      }
      auVar163._4_8_ = pvVar69;
      auVar163._0_4_ = uVar100;
      auVar163._12_4_ = 0;
      local_458 = auVar163 << 0x20;
    }
  }
  local_458._0_4_ = uVar67;
  if (local_418._4_4_ < (int)uVar67) {
    if (local_418._4_4_ == 0) {
      uVar100 = 8;
    }
    else {
      uVar100 = local_418._4_4_ / 2 + local_418._4_4_;
    }
    if ((int)uVar100 <= (int)uVar67) {
      uVar100 = uVar67;
    }
    if (local_418._4_4_ < (int)uVar100) {
      pvVar69 = ImGui::MemAlloc((long)(int)uVar100 * 0x1c);
      if (pvStack_410 != (void *)0x0) {
        memcpy(pvVar69,pvStack_410,(long)(int)(stbtt_uint32)local_418 * 0x1c);
        ImGui::MemFree(pvStack_410);
      }
      local_418 = (ulong)uVar100 << 0x20;
      pvStack_410 = pvVar69;
    }
  }
  local_418 = CONCAT44(local_418._4_4_,uVar67);
  iVar68 = 0;
  memset((void *)local_458._8_8_,0,(long)(int)local_458._0_4_ << 4);
  memset(pvStack_410,0,(long)(int)(stbtt_uint32)local_418 * 0x1c);
  fVar118 = 0.0;
  if (0 < iVar185) {
    lVar97 = 0;
    iVar96 = 0;
    iVar98 = 0;
    do {
      iVar79 = *(int *)((long)__dest + lVar97 * 0x110 + 0xe8);
      if (iVar79 != 0) {
        psVar87 = (stbtt_fontinfo *)((long)__dest + lVar97 * 0x110);
        *(long *)&psVar87[1].hmtx = (long)iVar96 * 0x10 + local_458._8_8_;
        pvVar69 = (void *)((long)iVar98 * 0x1c + (long)pvStack_410);
        *(void **)&psVar87[1].gpos = pvVar69;
        pIVar94 = (atlas->ConfigData).Data;
        fVar118 = pIVar94[lVar97].SizePixels;
        *(float *)&psVar87[1].userdata = fVar118;
        *(undefined4 *)((long)&psVar87[1].userdata + 4) = 0;
        psVar87[1].data = *(uchar **)&psVar87[1].gsubrs.cursor;
        psVar87[1].fontstart = *(int *)&psVar87[1].gsubrs.data;
        *(void **)&psVar87[1].loca = pvVar69;
        *(char *)&psVar87[1].glyf = (char)pIVar94[lVar97].OversampleH;
        *(char *)((long)&psVar87[1].glyf + 1) = (char)pIVar94[lVar97].OversampleV;
        if (fVar118 <= 0.0) {
          fVar118 = -fVar118;
          uVar67 = (uint)(ushort)(*(ushort *)(psVar87->data + (long)psVar87->head + 0x12) << 8 |
                                 *(ushort *)(psVar87->data + (long)psVar87->head + 0x12) >> 8);
        }
        else {
          puVar73 = psVar87->data;
          lVar80 = (long)psVar87->hhea;
          uVar67 = ((int)(short)((ushort)puVar73[lVar80 + 4] << 8) | (uint)puVar73[lVar80 + 5]) -
                   ((int)(short)((ushort)puVar73[lVar80 + 6] << 8) | (uint)puVar73[lVar80 + 7]);
        }
        fVar118 = fVar118 / (float)(int)uVar67;
        iVar96 = iVar96 + iVar79;
        iVar98 = iVar98 + iVar79;
        if (0 < *(int *)&psVar87[1].gsubrs.data) {
          local_448._0_4_ = iVar98;
          iVar98 = atlas->TexGlyphPadding;
          lVar101 = 6;
          lVar80 = 0;
          do {
            iVar79 = stbtt_FindGlyphIndex
                               (psVar87,*(int *)(*(long *)&psVar87[1].gsubrs.cursor + lVar80 * 4));
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar87,iVar79,(float)pIVar94[lVar97].OversampleH * fVar118,
                       (float)pIVar94[lVar97].OversampleV * fVar118,fVar118,in_XMM3._0_4_,
                       (int *)local_288,(int *)&local_480,(int *)&local_428,(int *)&local_480.fdx);
            uVar67 = (pIVar94[lVar97].OversampleH +
                     (((stbtt_uint32)local_428 + iVar98) - (int)local_288[0].data)) - 1;
            lVar85 = *(long *)&psVar87[1].hmtx;
            *(short *)(lVar85 + -2 + lVar101) = (short)uVar67;
            uVar100 = (pIVar94[lVar97].OversampleV +
                      (((int)local_480.fdx + iVar98) - (int)local_480.next)) - 1;
            *(short *)(lVar85 + lVar101) = (short)uVar100;
            iVar68 = iVar68 + (uVar100 & 0xffff) * (uVar67 & 0xffff);
            lVar80 = lVar80 + 1;
            lVar101 = lVar101 + 0x10;
          } while (lVar80 < *(int *)&psVar87[1].gsubrs.data);
          iVar98 = local_448._0_4_;
        }
      }
      lVar97 = lVar97 + 1;
    } while (lVar97 < iVar185);
    fVar118 = (float)iVar68;
  }
  if (fVar118 < 0.0) {
    fVar118 = sqrtf(fVar118);
  }
  else {
    fVar118 = SQRT(fVar118);
  }
  atlas->TexHeight = 0;
  local_480.ey = (float)atlas->TexDesiredWidth;
  if ((int)local_480.ey < 1) {
    iVar68 = (int)fVar118;
    local_480.ey = 5.73972e-42;
    if ((iVar68 < 0xb33) && (local_480.ey = 2.86986e-42, iVar68 < 0x599)) {
      local_480.ey = (float)((uint)(0x2cb < iVar68) * 0x200 + 0x200);
    }
  }
  atlas->TexWidth = (int)local_480.ey;
  uVar67 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar68 = (int)local_480.ey - uVar67;
  local_408 = (stbrp_node *)ImGui::MemAlloc((long)iVar68 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_408 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_408 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_408);
    }
    local_408 = (stbrp_node *)0x0;
    uVar67 = 0;
    local_480.ey = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (iVar68 < 2) {
      uVar70 = 0;
    }
    else {
      uVar70 = 0;
      psVar36 = local_408;
      do {
        uVar70 = uVar70 + 1;
        psVar36->next = psVar36 + 1;
        psVar36 = psVar36 + 1;
      } while (iVar68 - 1 != uVar70);
      uVar70 = uVar70 & 0xffffffff;
    }
    local_408[uVar70].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_408;
    ptr->active_head = ptr->extra;
    ptr->width = iVar68;
    ptr->height = 0x8000 - uVar67;
    ptr->num_nodes = iVar68;
    ptr->align = (iVar68 * 2 + -1) / iVar68;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar68;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_368 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < iVar185) {
    lVar97 = 0;
    pvVar69 = __dest;
    do {
      lVar80 = lVar97 * 0x110;
      iVar68 = *(int *)((long)pvVar69 + lVar80 + 0xe8);
      __dest = pvVar69;
      if (iVar68 != 0) {
        stbrp_pack_rects(local_368,*(stbrp_rect **)((long)pvVar69 + lVar80 + 200),iVar68);
        lVar101 = (long)*(int *)((long)pvVar69 + lVar80 + 0xe8);
        if (0 < lVar101) {
          lVar80 = *(long *)((long)pvVar69 + lVar80 + 200);
          lVar85 = 0;
          do {
            if (*(int *)(lVar80 + 0xc + lVar85) != 0) {
              iVar68 = (uint)*(ushort *)(lVar80 + 6 + lVar85) +
                       (uint)*(ushort *)(lVar80 + 10 + lVar85);
              if (iVar68 < atlas->TexHeight) {
                iVar68 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar68;
            }
            lVar85 = lVar85 + 0x10;
          } while (lVar101 * 0x10 != lVar85);
        }
      }
      lVar97 = lVar97 + 1;
      pvVar69 = __dest;
    } while (lVar97 < iVar185);
  }
  uVar100 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar100 = (int)(uVar100 - 1) >> 1 | uVar100 - 1;
    uVar100 = (int)uVar100 >> 2 | uVar100;
    uVar100 = (int)uVar100 >> 4 | uVar100;
    uVar100 = (int)uVar100 >> 8 | uVar100;
    uVar100 = (int)uVar100 >> 0x10 | uVar100;
  }
  iVar68 = uVar100 + 1;
  atlas->TexHeight = iVar68;
  auVar105._0_4_ = (float)atlas->TexWidth;
  auVar105._4_4_ = (float)iVar68;
  auVar105._8_8_ = 0;
  auVar119 = divps(_DAT_00194dc0,auVar105);
  atlas->TexUvScale = auVar119._0_8_;
  puVar73 = (uchar *)ImGui::MemAlloc((long)(iVar68 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar73;
  memset(puVar73,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < iVar185) {
    local_3b0 = atlas->TexPixelsAlpha8;
    local_460 = (long)(int)local_480.ey;
    local_68 = pshuflw(ZEXT416(uVar67),ZEXT416(uVar67),0);
    lVar97 = 0;
    auVar121 = _DAT_00194020;
    auVar119 = _DAT_00196690;
    do {
      local_360 = lVar97;
      if (*(int *)((long)__dest + lVar97 * 0x110 + 0xe8) != 0) {
        psVar87 = (stbtt_fontinfo *)((long)__dest + lVar97 * 0x110);
        local_328 = *(float *)&psVar87[1].userdata;
        if (local_328 <= 0.0) {
          local_328 = (float)((uint)local_328 ^ auVar121._0_4_);
          uStack_324 = auVar121._4_4_;
          uStack_320 = auVar121._8_4_;
          uStack_31c = auVar121._12_4_;
          uVar67 = (uint)(ushort)(*(ushort *)(psVar87->data + (long)psVar87->head + 0x12) << 8 |
                                 *(ushort *)(psVar87->data + (long)psVar87->head + 0x12) >> 8);
        }
        else {
          puVar73 = psVar87->data;
          lVar97 = (long)psVar87->hhea;
          uVar67 = ((int)(short)((ushort)puVar73[lVar97 + 4] << 8) | (uint)puVar73[lVar97 + 5]) -
                   ((int)(short)((ushort)puVar73[lVar97 + 6] << 8) | (uint)puVar73[lVar97 + 7]);
          uStack_324 = 0;
          uStack_320 = 0;
          uStack_31c = 0;
        }
        local_328 = local_328 / (float)(int)uVar67;
        local_300 = (atlas->ConfigData).Data;
        if (0 < psVar87[1].fontstart) {
          lVar97._0_4_ = psVar87[1].hmtx;
          lVar97._4_4_ = psVar87[1].kern;
          local_298._0_4_ = psVar87[1].glyf;
          local_298._4_4_ = psVar87[1].hhea;
          uStack_290 = 0;
          auVar47._8_6_ = 0;
          auVar47._0_8_ = local_298;
          auVar47[0xe] = (char)((uint)local_298._4_4_ >> 0x18);
          auVar50._8_4_ = 0;
          auVar50._0_8_ = local_298;
          auVar50[0xc] = (char)((uint)local_298._4_4_ >> 0x10);
          auVar50._13_2_ = auVar47._13_2_;
          auVar51._8_4_ = 0;
          auVar51._0_8_ = local_298;
          auVar51._12_3_ = auVar50._12_3_;
          auVar52._8_2_ = 0;
          auVar52._0_8_ = local_298;
          auVar52[10] = (char)((uint)local_298._4_4_ >> 8);
          auVar52._11_4_ = auVar51._11_4_;
          auVar53._8_2_ = 0;
          auVar53._0_8_ = local_298;
          auVar53._10_5_ = auVar52._10_5_;
          auVar54[8] = (char)local_298._4_4_;
          auVar54._0_8_ = local_298;
          auVar54._9_6_ = auVar53._9_6_;
          cVar115 = (char)((uint)(undefined4)local_298 >> 0x18);
          Var40 = CONCAT91((unkuint9)auVar54._8_7_ << 8,cVar115);
          auVar45[10] = 0;
          auVar45._0_10_ = Var40;
          cVar114 = (char)((uint)(undefined4)local_298 >> 0x10);
          auVar39._1_11_ = auVar45 << 8;
          auVar39[0] = cVar114;
          auVar44[0xc] = 0;
          auVar44._0_12_ = auVar39;
          bVar113 = (byte)((uint)(undefined4)local_298 >> 8);
          auVar38._1_13_ = auVar44 << 8;
          auVar38[0] = bVar113;
          bVar103 = (byte)(undefined4)local_298;
          auVar106._0_2_ = CONCAT11(0,bVar103);
          auVar106._2_14_ = auVar38;
          uVar58 = auVar38._0_2_;
          sVar35 = -auVar39._0_2_;
          uVar117 = (ushort)Var40;
          sVar59 = -uVar117;
          local_3d8 = (ulong)uVar58;
          auVar48._10_2_ = 0;
          auVar48._0_10_ = auVar106._0_10_;
          auVar48._12_2_ = uVar117;
          uVar55 = CONCAT42(auVar48._10_4_,auVar39._0_2_);
          auVar107._4_2_ = uVar58;
          auVar107._0_4_ = auVar106._0_4_;
          auVar107._6_10_ = (unkuint10)uVar55 << 0x10;
          auVar108._0_4_ = (float)auVar106._0_2_;
          auVar108._4_4_ = (float)auVar107._4_4_;
          auVar108._8_4_ = (float)(int)uVar55;
          auVar108._12_4_ = (float)uVar117;
          local_58 = divps(_DAT_00194dc0,auVar108);
          auVar134[0] = -(bVar103 == 0);
          auVar134[1] = -(bVar103 == 0);
          auVar134[2] = -(bVar103 == 0);
          auVar134[3] = -(bVar103 == 0);
          auVar134[4] = -(bVar113 == 0);
          auVar134[5] = -(bVar113 == 0);
          auVar134[6] = -(bVar113 == 0);
          auVar134[7] = -(bVar113 == 0);
          auVar134[8] = -(cVar114 == '\0');
          auVar134[9] = -(cVar114 == '\0');
          auVar134[10] = -(cVar114 == '\0');
          auVar134[0xb] = -(cVar114 == '\0');
          auVar134[0xc] = -(cVar115 == '\0');
          auVar134[0xd] = -(cVar115 == '\0');
          auVar134[0xe] = -(cVar115 == '\0');
          auVar134[0xf] = -(cVar115 == '\0');
          Var43 = CONCAT64(CONCAT42(CONCAT22(sVar59,sVar59),sVar35),CONCAT22(sVar35,sVar59));
          auVar41._4_8_ = (long)((unkuint10)Var43 >> 0x10);
          auVar41._2_2_ = 1 - uVar58;
          auVar41._0_2_ = 1 - uVar58;
          auVar120._0_4_ = (float)(int)(short)(1 - auVar106._0_2_);
          auVar120._4_4_ = (float)(auVar41._0_4_ >> 0x10);
          auVar120._8_4_ = (float)((int)((unkuint10)Var43 >> 0x10) >> 0x10);
          auVar120._12_4_ = (float)(int)sVar59;
          local_2a8 = local_328 * auVar108._0_4_;
          local_2b8 = local_328 * auVar108._4_4_;
          auVar109._0_4_ = auVar108._0_4_ + auVar108._0_4_;
          auVar109._4_4_ = auVar108._4_4_ + auVar108._4_4_;
          auVar109._8_4_ = auVar108._8_4_ + auVar108._8_4_;
          auVar109._12_4_ = auVar108._12_4_ + auVar108._12_4_;
          auVar121 = divps(auVar120,auVar109);
          local_48._0_16_ = ~auVar134 & auVar121;
          fVar118 = local_2b8;
          if (local_2a8 <= local_2b8) {
            fVar118 = local_2a8;
          }
          local_3c4 = (0.35 / fVar118) * (0.35 / fVar118);
          fStack_2b4 = local_2b8;
          fStack_2b0 = local_2b8;
          fStack_2ac = local_2b8;
          fStack_74 = (float)((uint)local_2b8 ^ (uint)DAT_00194020);
          local_338 = local_298 & 0xff;
          local_340 = (ulong)bVar113;
          uVar70 = (ulong)(auVar106._0_4_ & 0xffff);
          local_480.fdy = (float)(int)uVar70;
          local_480.direction = (float)(int)(uVar70 >> 0x20);
          fStack_2a4 = local_2b8;
          fStack_2a0 = local_328 * auVar108._8_4_;
          fStack_29c = local_328 * auVar108._12_4_;
          local_78 = local_2a8;
          fStack_70 = local_2a8;
          fStack_6c = fStack_74;
          lVar80 = 0;
          local_358 = psVar87;
          local_2f8 = lVar97;
          auVar121 = _DAT_00194020;
          do {
            if (*(int *)(lVar97 + 0xc + lVar80 * 0x10) != 0) {
              if (psVar87[1].data == (uchar *)0x0) {
                iVar68 = *(int *)((long)&psVar87[1].userdata + 4) + (int)lVar80;
              }
              else {
                iVar68 = *(int *)(psVar87[1].data + lVar80 * 4);
              }
              lVar97 = lVar80 * 0x10 + lVar97;
              local_2f0 = (undefined4 *)(lVar80 * 0x1c + *(long *)&psVar87[1].loca);
              local_2e8 = lVar80;
              iVar98 = stbtt_FindGlyphIndex(psVar87,iVar68);
              fVar118 = auVar119._0_4_;
              uVar152 = *(undefined8 *)(lVar97 + 4);
              *(ulong *)(lVar97 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar152 >> 0x30) + local_68._6_2_,
                                     (short)((ulong)uVar152 >> 0x20) + local_68._4_2_),
                            CONCAT22((short)((ulong)uVar152 >> 0x10) - local_68._2_2_,
                                     (short)uVar152 - local_68._0_2_));
              puVar73 = psVar87->data;
              uVar58 = *(ushort *)(puVar73 + (long)psVar87->hhea + 0x22) << 8 |
                       *(ushort *)(puVar73 + (long)psVar87->hhea + 0x22) >> 8;
              iVar68 = psVar87->hmtx;
              lVar80 = (ulong)uVar58 * 4 + (long)iVar68 + -4;
              lVar101 = (ulong)uVar58 * 4 + (long)iVar68 + -3;
              if (iVar98 < (int)(uint)uVar58) {
                lVar80 = (long)(iVar98 * 4) + (long)iVar68;
                lVar101 = (long)(iVar98 * 4) + 1 + (long)iVar68;
              }
              local_380 = (uint)puVar73[lVar80];
              local_384 = (uint)puVar73[lVar101];
              auVar121 = local_68;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar87,iVar98,local_2a8,local_2b8,local_68._0_4_,fVar118,&local_370,
                         &local_374,&local_2bc,&local_2c0);
              auVar119 = local_448;
              fVar104 = auVar121._0_4_;
              local_448._2_6_ = 0;
              local_448._0_2_ = *(ushort *)(lVar97 + 8);
              local_448._8_8_ = auVar119._8_8_;
              puVar73 = (uchar *)(ulong)*(ushort *)(lVar97 + 10);
              local_3f0 = (ulong)*(ushort *)(lVar97 + 4);
              local_3c0 = (ulong)*(ushort *)(lVar97 + 6);
              local_3a8 = lVar97;
              uVar67 = stbtt_GetGlyphShape(psVar87,iVar98,(stbtt_vertex **)&local_428);
              uVar100 = ((int)local_3f0 - local_480.fdy) + 1;
              local_350 = (ulong)(uint)-(int)local_3d8;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_358,iVar98,local_2a8,local_2b8,fVar104,fVar118,(int *)&local_480.fdx,
                         &local_36c,(int *)0x0,(int *)0x0);
              local_3fc = uVar100;
              if (uVar100 != 0) {
                iVar68 = (int)local_350 + (int)local_3c0 + 1;
                local_3e8._0_4_ = iVar68;
                if (iVar68 != 0) {
                  lVar97 = CONCAT44(local_428._4_4_,(stbtt_uint32)local_428);
                  local_420 = local_36c;
                  local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                  if ((int)uVar67 < 1) {
                    uVar100 = 0;
                  }
                  else {
                    lVar80 = 0;
                    uVar100 = 0;
                    do {
                      uVar100 = uVar100 + (*(char *)(lVar97 + 0xc + lVar80) == '\x01');
                      lVar80 = lVar80 + 0xe;
                    } while ((ulong)uVar67 * 0xe != lVar80);
                  }
                  fVar118 = local_480.fdx;
                  local_3b8 = puVar73;
                  if (uVar100 == 0) {
LAB_0013c0f8:
                    pvVar69 = (void *)0x0;
LAB_0013c0fa:
                    points = (stbtt__point *)0x0;
                  }
                  else {
                    pvVar69 = ImGui::MemAlloc((long)(int)uVar100 << 2);
                    if (pvVar69 == (void *)0x0) {
                      uVar100 = 0;
                      goto LAB_0013c0fa;
                    }
                    iVar68 = 0;
                    points = (stbtt__point *)0x0;
                    local_3f8 = pvVar69;
                    iVar98 = 0;
                    do {
                      if (iVar98 == 0) {
LAB_0013bece:
                        local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000)
                        ;
                        if ((int)uVar67 < 1) {
                          lVar80 = -1;
                        }
                        else {
                          fVar104 = 0.0;
                          fVar140 = 0.0;
                          uVar122 = 0xffffffff;
                          lVar80 = 0;
                          do {
                            puVar73 = local_288[0].data;
                            switch(*(undefined1 *)(lVar97 + 0xc + lVar80)) {
                            case 1:
                              if (-1 < (int)uVar122) {
                                *(int *)((long)local_3f8 + (ulong)uVar122 * 4) =
                                     (int)local_288[0].data - iVar68;
                              }
                              uVar122 = uVar122 + 1;
                              auVar119 = pshuflw(ZEXT416(*(uint *)(lVar97 + lVar80)),
                                                 ZEXT416(*(uint *)(lVar97 + lVar80)),0x60);
                              iVar96 = auVar119._0_4_;
                              iVar79 = auVar119._4_4_;
                              iVar68 = (int)local_288[0].data;
                              break;
                            case 2:
                              auVar119 = pshuflw(ZEXT416(*(uint *)(lVar97 + lVar80)),
                                                 ZEXT416(*(uint *)(lVar97 + lVar80)),0x60);
                              iVar96 = auVar119._0_4_;
                              iVar79 = auVar119._4_4_;
                              break;
                            case 3:
                              stbtt__tesselate_curve
                                        (points,(int *)local_288,fVar104,fVar140,
                                         (float)(int)*(short *)(lVar97 + 4 + lVar80),
                                         (float)(int)*(short *)(lVar97 + 6 + lVar80),
                                         (float)(int)*(short *)(lVar97 + lVar80),
                                         (float)(int)*(short *)(lVar97 + 2 + lVar80),local_3c4,0);
                              goto LAB_0013c033;
                            case 4:
                              stbtt__tesselate_cubic
                                        (points,(int *)local_288,fVar104,fVar140,
                                         (float)(int)*(short *)(lVar97 + 4 + lVar80),
                                         (float)(int)*(short *)(lVar97 + 6 + lVar80),
                                         (float)(int)*(short *)(lVar97 + 8 + lVar80),
                                         (float)(int)*(short *)(lVar97 + 10 + lVar80),
                                         (float)(int)*(short *)(lVar97 + lVar80),
                                         (float)(int)*(short *)(lVar97 + 2 + lVar80),local_3c4,0);
LAB_0013c033:
                              auVar119 = pshuflw(ZEXT416(*(uint *)(lVar97 + lVar80)),
                                                 ZEXT416(*(uint *)(lVar97 + lVar80)),0x60);
                              fVar104 = (float)(auVar119._0_4_ >> 0x10);
                              fVar140 = (float)(auVar119._4_4_ >> 0x10);
                              puVar73 = local_288[0].data;
                            default:
                              goto switchD_0013bf13_default;
                            }
                            puVar73 = (uchar *)CONCAT44(local_288[0].data._4_4_,
                                                        (int)local_288[0].data + 1);
                            fVar140 = (float)(iVar79 >> 0x10);
                            fVar104 = (float)(iVar96 >> 0x10);
                            if (points != (stbtt__point *)0x0) {
                              points[(int)local_288[0].data].x = fVar104;
                              points[(int)local_288[0].data].y = fVar140;
                            }
switchD_0013bf13_default:
                            local_288[0].data = puVar73;
                            lVar80 = lVar80 + 0xe;
                          } while ((ulong)uVar67 * 0xe != lVar80);
                          lVar80 = (long)(int)uVar122;
                          puVar73 = local_3b8;
                        }
                        *(int *)((long)local_3f8 + lVar80 * 4) = (int)local_288[0].data - iVar68;
                        bVar102 = true;
                      }
                      else {
                        points = (stbtt__point *)ImGui::MemAlloc((long)(int)local_288[0].data << 3);
                        if (points != (stbtt__point *)0x0) goto LAB_0013bece;
                        points = (stbtt__point *)0x0;
                        bVar102 = false;
                      }
                      if (!bVar102) {
                        ImGui::MemFree(points);
                        ImGui::MemFree(local_3f8);
                        uVar100 = 0;
                        goto LAB_0013c0f8;
                      }
                      bVar102 = iVar98 == 0;
                      pvVar69 = local_3f8;
                      iVar98 = iVar98 + 1;
                    } while (bVar102);
                  }
                  local_3a0 = points;
                  if (points != (stbtt__point *)0x0) {
                    if ((int)uVar100 < 1) {
                      size = 0x14;
                    }
                    else {
                      uVar70 = 0;
                      lVar97 = 0;
                      do {
                        lVar97 = (long)(int)lVar97 + (long)*(int *)((long)pvVar69 + uVar70 * 4);
                        uVar70 = uVar70 + 1;
                      } while (uVar100 != uVar70);
                      size = lVar97 * 0x14 + 0x14;
                    }
                    psVar74 = (stbtt__edge *)ImGui::MemAlloc(size);
                    if (psVar74 != (stbtt__edge *)0x0) {
                      if ((int)uVar100 < 1) {
                        uVar67 = 0;
                      }
                      else {
                        uVar70 = 0;
                        uVar67 = 0;
                        iVar68 = 0;
                        do {
                          iVar98 = *(int *)((long)pvVar69 + uVar70 * 4);
                          if (0 < iVar98) {
                            uVar92 = (ulong)(iVar98 - 1);
                            uVar90 = 0;
                            do {
                              iVar96 = (int)uVar92;
                              fVar104 = local_3a0[(long)iVar68 + (long)iVar96].y;
                              fVar140 = local_3a0[(long)iVar68 + uVar90].y;
                              if ((fVar104 != fVar140) || (NAN(fVar104) || NAN(fVar140))) {
                                iVar95 = (int)uVar90;
                                iVar79 = iVar96;
                                if (fVar104 <= fVar140) {
                                  iVar79 = iVar95;
                                  iVar95 = iVar96;
                                }
                                psVar74[(int)uVar67].invert = (uint)(fVar140 < fVar104);
                                sVar6 = local_3a0[(long)iVar68 + (long)iVar79];
                                sVar7 = local_3a0[(long)iVar68 + (long)iVar95];
                                psVar91 = psVar74 + (int)uVar67;
                                psVar91->x0 = sVar6.x * local_78 + 0.0;
                                psVar91->y0 = sVar6.y * fStack_74 + 0.0;
                                psVar91->x1 = sVar7.x * fStack_70 + 0.0;
                                psVar91->y1 = sVar7.y * fStack_6c + 0.0;
                                uVar67 = uVar67 + 1;
                                puVar73 = local_3b8;
                              }
                              uVar92 = uVar90 & 0xffffffff;
                              uVar90 = uVar90 + 1;
                            } while ((long)uVar90 < (long)*(int *)((long)pvVar69 + uVar70 * 4));
                          }
                          iVar68 = iVar68 + iVar98;
                          uVar70 = uVar70 + 1;
                        } while (uVar70 != uVar100);
                      }
                      iVar68 = local_480.fdy;
                      local_330 = psVar74;
                      stbtt__sort_edges_quicksort(psVar74,uVar67);
                      if (1 < (int)uVar67) {
                        uVar70 = 1;
                        do {
                          uVar3 = psVar74[uVar70].x0;
                          uVar8 = psVar74[uVar70].y0;
                          iVar98 = psVar74[uVar70].invert;
                          local_288[0].cursor = iVar98;
                          local_288[0].data = *(uchar **)&psVar74[uVar70].x1;
                          uVar90 = uVar70 & 0xffffffff;
                          do {
                            uVar100 = (uint)uVar90;
                            if ((int)uVar100 < 1) break;
                            fVar104 = psVar74[uVar90 - 1].y0;
                            if ((float)uVar8 < fVar104) {
                              psVar91 = psVar74 + uVar90;
                              psVar91->invert = psVar91[-1].invert;
                              fVar140 = psVar91[-1].y0;
                              fVar141 = psVar91[-1].x1;
                              fVar142 = psVar91[-1].y1;
                              psVar91->x0 = psVar91[-1].x0;
                              psVar91->y0 = fVar140;
                              psVar91->x1 = fVar141;
                              psVar91->y1 = fVar142;
                              uVar90 = (ulong)(uVar100 - 1);
                            }
                            uVar100 = (uint)uVar90;
                          } while ((float)uVar8 < fVar104);
                          if (uVar70 != uVar100) {
                            psVar74[(int)uVar100].x0 = (float)uVar3;
                            psVar74[(int)uVar100].y0 = (float)uVar8;
                            *(uchar **)&psVar74[(int)uVar100].x1 = local_288[0].data;
                            psVar74[(int)uVar100].invert = iVar98;
                          }
                          uVar70 = uVar70 + 1;
                        } while (uVar70 != uVar67);
                      }
                      uVar100 = (int)local_3f0 - iVar68;
                      local_3f0 = (ulong)uVar100;
                      local_480.next = (stbtt__active_edge *)0x0;
                      scanline = local_288;
                      if (0x3f < (int)uVar100) {
                        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                      }
                      uVar100 = (int)local_3c0 - (int)local_3d8;
                      local_3c0 = (ulong)uVar100;
                      psVar74[(int)uVar67].y0 = (float)(local_3e8._0_4_ + local_420) + 1.0;
                      local_3f8 = pvVar69;
                      if (uVar100 < 0x7fffffff) {
                        local_3b8 = local_3b0 + (long)puVar73 * local_460 + local_448._0_8_;
                        lVar97 = (long)(int)local_3fc;
                        local_390 = (float *)((long)&scanline->data + lVar97 * 4);
                        local_37c = (float)(int)fVar118;
                        local_348 = local_390 + 1;
                        local_2d8 = lVar97 * 4;
                        local_400 = (float)(int)local_3fc;
                        local_2e0 = (long)(int)(uint)local_3f0 * 4 + 8;
                        local_398 = 0;
                        local_2d0 = 0;
                        local_3d0 = (undefined8 *)0x0;
                        local_41c = 0;
                        psVar78 = (stbtt__active_edge *)0x0;
                        local_2c8 = lVar97;
                        do {
                          fVar118 = (float)local_420;
                          fVar104 = fVar118 + 1.0;
                          memset(scanline,0,local_2d8);
                          memset(local_390,0,local_2e0);
                          if (local_480.next != (stbtt__active_edge *)0x0) {
                            psVar77 = local_480.next;
                            psVar83 = &local_480;
                            do {
                              psVar84 = psVar77;
                              if (psVar77->ey <= fVar118) {
                                psVar83->next = psVar77->next;
                                psVar77->direction = 0.0;
                                psVar77->next = psVar78;
                                psVar84 = psVar83;
                                psVar78 = psVar77;
                              }
                              psVar77 = psVar84->next;
                              psVar83 = psVar84;
                            } while (psVar77 != (stbtt__active_edge *)0x0);
                          }
                          fVar140 = psVar74->y0;
                          psVar77 = local_480.next;
                          iVar68 = local_420;
                          fVar141 = local_318;
                          uVar70 = local_2d0;
                          if (fVar140 <= fVar104) {
                            do {
                              if ((fVar140 != psVar74->y1) || (NAN(fVar140) || NAN(psVar74->y1))) {
                                if (psVar78 == (stbtt__active_edge *)0x0) {
                                  psVar77 = psVar78;
                                  if (local_41c == 0) {
                                    puVar76 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                    if (puVar76 == (undefined8 *)0x0) {
                                      psVar83 = (stbtt__active_edge *)0x0;
                                      goto LAB_0013cb7e;
                                    }
                                    *puVar76 = local_3d0;
                                    local_41c = 800;
                                    local_3d0 = puVar76;
                                  }
                                  lVar80 = (long)local_41c;
                                  local_41c = local_41c + -1;
                                  psVar83 = (stbtt__active_edge *)(local_3d0 + lVar80 * 4 + -3);
                                }
                                else {
                                  psVar77 = psVar78->next;
                                  psVar83 = psVar78;
                                }
LAB_0013cb7e:
                                psVar78 = psVar77;
                                if (psVar83 != (stbtt__active_edge *)0x0) {
                                  uVar4 = psVar74->x0;
                                  uVar9 = psVar74->y0;
                                  uVar5 = psVar74->x1;
                                  uVar10 = psVar74->y1;
                                  fVar140 = ((float)uVar5 - (float)uVar4) /
                                            ((float)uVar10 - (float)uVar9);
                                  psVar83->fdx = fVar140;
                                  psVar83->fdy = (float)(-(uint)(fVar140 != 0.0) &
                                                        (uint)(1.0 / fVar140));
                                  psVar83->fx = ((fVar118 - (float)uVar9) * fVar140 + (float)uVar4)
                                                - local_37c;
                                  psVar83->direction =
                                       *(float *)(&DAT_00196718 + (ulong)(psVar74->invert == 0) * 4)
                                  ;
                                  psVar83->sy = (float)uVar9;
                                  psVar83->ey = (float)uVar10;
                                  psVar83->next = (stbtt__active_edge *)0x0;
                                  psVar83->next = local_480.next;
                                  local_480.next = psVar83;
                                }
                              }
                              fVar140 = psVar74[1].y0;
                              psVar74 = psVar74 + 1;
                              psVar77 = local_480.next;
                              iVar68 = local_420;
                              fVar141 = local_318;
                              uVar70 = local_2d0;
                            } while (fVar140 <= fVar104);
                          }
                          for (; local_318 = fVar141, psVar77 != (stbtt__active_edge *)0x0;
                              psVar77 = psVar77->next) {
                            local_318 = psVar77->fx;
                            fVar140 = psVar77->fdx;
                            local_420 = iVar68;
                            local_2d0 = uVar70;
                            if ((fVar140 != 0.0) || (NAN(fVar140))) {
                              fVar146 = fVar140 + local_318;
                              fVar142 = psVar77->sy;
                              fVar143 = (float)(~-(uint)(fVar118 < fVar142) & (uint)local_318 |
                                               (uint)((fVar142 - fVar118) * fVar140 + local_318) &
                                               -(uint)(fVar118 < fVar142));
                              if (0.0 <= fVar143) {
                                fVar147 = psVar77->ey;
                                fVar148 = (float)(-(uint)(fVar147 < fVar104) &
                                                  (uint)((fVar147 - fVar118) * fVar140 + local_318)
                                                 | ~-(uint)(fVar147 < fVar104) & (uint)fVar146);
                                if (((0.0 <= fVar148) && (fVar143 < local_400)) &&
                                   (fVar148 < local_400)) {
                                  if (fVar142 <= fVar118) {
                                    fVar142 = fVar118;
                                  }
                                  iVar68 = (int)fVar143;
                                  if (fVar104 <= fVar147) {
                                    fVar147 = fVar104;
                                  }
                                  if (iVar68 == (int)fVar148) {
                                    lVar97 = (long)iVar68;
                                    *(float *)((long)&scanline->data + lVar97 * 4) =
                                         (((fVar148 - (float)iVar68) + (fVar143 - (float)iVar68)) *
                                          -0.5 + 1.0) * psVar77->direction * (fVar147 - fVar142) +
                                         *(float *)((long)&scanline->data + lVar97 * 4);
                                    fVar146 = (fVar147 - fVar142) * psVar77->direction;
                                  }
                                  else {
                                    fVar140 = psVar77->fdy;
                                    fVar149 = fVar148;
                                    if (fVar148 < fVar143) {
                                      fVar157 = fVar118 - fVar142;
                                      fVar142 = (fVar118 - fVar147) + fVar104;
                                      fVar140 = -fVar140;
                                      local_318 = fVar146;
                                      fVar149 = fVar143;
                                      fVar147 = fVar157 + fVar104;
                                      fVar143 = fVar148;
                                    }
                                    iVar98 = (int)fVar149;
                                    iVar68 = (int)fVar143 + 1;
                                    fVar157 = ((float)iVar68 - local_318) * fVar140 + fVar118;
                                    fVar146 = psVar77->direction;
                                    fVar148 = (fVar157 - fVar142) * fVar146;
                                    lVar97 = (long)(int)fVar143;
                                    *(float *)((long)&scanline->data + lVar97 * 4) =
                                         (((fVar143 - (float)(int)fVar143) + 1.0) * -0.5 + 1.0) *
                                         fVar148 + *(float *)((long)&scanline->data + lVar97 * 4);
                                    if (iVar98 - iVar68 != 0 && iVar68 <= iVar98) {
                                      do {
                                        *(float *)((long)&scanline->data + lVar97 * 4 + 4) =
                                             fVar140 * fVar146 * 0.5 + fVar148 +
                                             *(float *)((long)&scanline->data + lVar97 * 4 + 4);
                                        fVar148 = fVar148 + fVar140 * fVar146;
                                        lVar97 = lVar97 + 1;
                                      } while (iVar98 + -1 != (int)lVar97);
                                    }
                                    lVar97 = (long)iVar98;
                                    *(float *)((long)&scanline->data + lVar97 * 4) =
                                         (fVar147 - (fVar140 * (float)(iVar98 - iVar68) + fVar157))
                                         * (((fVar149 - (float)iVar98) + 0.0) * -0.5 + 1.0) *
                                           fVar146 + fVar148 +
                                         *(float *)((long)&scanline->data + lVar97 * 4);
                                    fVar146 = (fVar147 - fVar142) * fVar146;
                                  }
                                  local_348[lVar97] = fVar146 + local_348[lVar97];
                                  goto LAB_0013ca52;
                                }
                              }
                              if ((uint)local_3f0 < 0x7fffffff) {
                                uStack_314 = 0;
                                uStack_310 = 0;
                                uStack_30c = 0;
                                uVar67 = 0;
                                fVar142 = fVar118;
                                local_3e8 = ZEXT416((uint)fVar146);
                                local_378 = fVar140;
                                do {
                                  fVar141 = (float)(int)uVar67;
                                  uVar100 = uVar67 + 1;
                                  fVar146 = (float)(int)uVar100;
                                  fVar140 = (fVar141 - local_318) / local_378 + fVar142;
                                  fVar143 = (fVar146 - local_318) / local_378 + fVar142;
                                  fVar147 = local_3e8._0_4_;
                                  fVar118 = fVar142;
                                  if ((fVar141 <= local_318) || (fVar147 <= fVar146)) {
                                    if ((fVar141 <= fVar147) || (local_318 <= fVar146)) {
                                      fVar148 = local_318;
                                      if (((fVar141 <= local_318) || (fVar147 <= fVar141)) &&
                                         ((fVar141 <= fVar147 || (local_318 <= fVar141)))) {
                                        fVar141 = local_318;
                                        if (((local_318 < fVar146) && (fVar146 < fVar147)) ||
                                           ((fVar140 = fVar142, fVar147 < fVar146 &&
                                            (fVar146 < local_318)))) {
                                          local_448._0_4_ = fVar143;
                                          goto LAB_0013c737;
                                        }
                                        goto LAB_0013c7ee;
                                      }
                                    }
                                    else {
                                      local_448._0_4_ = fVar143;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar67,psVar77,local_318,fVar142,
                                                 fVar146,fVar143);
                                      fVar148 = fVar146;
                                      fVar142 = (float)local_448._0_4_;
                                    }
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar67,psVar77,fVar148,fVar142,
                                               fVar141,fVar140);
                                  }
                                  else {
                                    local_448._0_4_ = fVar143;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar67,psVar77,local_318,fVar142,
                                               fVar141,fVar140);
                                    fVar143 = (float)local_448._0_4_;
                                    fVar142 = fVar140;
LAB_0013c737:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar67,psVar77,fVar141,fVar142,
                                               fVar146,fVar143);
                                    fVar141 = fVar146;
                                    fVar140 = (float)local_448._0_4_;
                                  }
LAB_0013c7ee:
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar67,psVar77,fVar141,fVar140,
                                             local_3e8._0_4_,fVar104);
                                  uVar67 = uVar100;
                                  fVar142 = fVar118;
                                  fVar141 = local_318;
                                } while (local_3fc != uVar100);
                              }
                            }
                            else if (local_318 < local_400) {
                              if (0.0 <= local_318) {
                                iVar68 = (int)local_318;
                                uStack_314 = 0;
                                uStack_310 = 0;
                                uStack_30c = 0;
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,iVar68,psVar77,local_318,fVar118,
                                           local_318,fVar104);
                                iVar68 = iVar68 + 1;
                                fVar140 = local_318;
                              }
                              else {
                                iVar68 = 0;
                                fVar140 = local_318;
                                local_318 = fVar141;
                              }
                              stbtt__handle_clipped_edge
                                        (local_390,iVar68,psVar77,fVar140,fVar118,fVar140,fVar104);
                              fVar141 = local_318;
                            }
LAB_0013ca52:
                            local_318 = fVar141;
                            lVar97 = local_2c8;
                            iVar68 = local_420;
                            fVar141 = local_318;
                            uVar70 = local_2d0;
                          }
                          psVar77 = local_480.next;
                          if ((uint)local_3f0 < 0x7fffffff) {
                            fVar118 = 0.0;
                            psVar75 = scanline;
                            uVar90 = local_398;
                            lVar80 = lVar97;
                            do {
                              fVar118 = fVar118 + *(float *)((long)&psVar75->data + lVar97 * 4);
                              iVar98 = (int)(ABS(*(float *)&psVar75->data + fVar118) * 255.0 + 0.5);
                              uVar89 = (uchar)iVar98;
                              if (0xfe < iVar98) {
                                uVar89 = 0xff;
                              }
                              local_3b8[(int)uVar90] = uVar89;
                              uVar90 = (ulong)((int)uVar90 + 1);
                              psVar75 = (stbtt__buf *)((long)&psVar75->data + 4);
                              lVar80 = lVar80 + -1;
                            } while (lVar80 != 0);
                          }
                          for (; psVar77 != (stbtt__active_edge *)0x0; psVar77 = psVar77->next) {
                            psVar77->fx = psVar77->fdx + psVar77->fx;
                          }
                          local_420 = iVar68 + 1;
                          local_2d0 = (ulong)((int)uVar70 + 1);
                          local_398 = (ulong)(uint)((int)local_398 + (int)local_480.ey);
                          pvVar17 = local_3f8;
                          puVar76 = local_3d0;
                          psVar91 = local_330;
                        } while ((int)uVar70 != (int)local_3c0);
                      }
                      else {
                        local_3d0 = (undefined8 *)0x0;
                        iVar68 = local_420;
                        pvVar17 = pvVar69;
                        puVar76 = local_3d0;
                        psVar91 = local_330;
                        uVar70 = local_2d0;
                      }
                      while (local_2d0 = uVar70, local_420 = iVar68, psVar74 = local_330,
                            pvVar69 = local_3f8, local_3f8 = pvVar17, local_330 = psVar91,
                            puVar76 != (undefined8 *)0x0) {
                        puVar18 = (undefined8 *)*puVar76;
                        ImGui::MemFree(puVar76);
                        iVar68 = local_420;
                        pvVar17 = local_3f8;
                        puVar76 = puVar18;
                        psVar91 = local_330;
                        uVar70 = local_2d0;
                        local_330 = psVar74;
                        local_3f8 = pvVar69;
                      }
                      if (scanline != local_288) {
                        ImGui::MemFree(scanline);
                      }
                      ImGui::MemFree(psVar74);
                    }
                    ImGui::MemFree(pvVar69);
                    ImGui::MemFree(local_3a0);
                  }
                }
              }
              ImGui::MemFree((void *)CONCAT44(local_428._4_4_,(stbtt_uint32)local_428));
              auVar119 = _DAT_00196690;
              if (1 < (byte)local_338) {
                uVar58 = *(ushort *)(local_3a8 + 4);
                uVar117 = *(ushort *)(local_3a8 + 6);
                local_288[0].data = (uchar *)0x0;
                if (uVar117 != 0) {
                  puVar73 = local_3b0 +
                            (ulong)*(ushort *)(local_3a8 + 10) * local_460 +
                            (ulong)*(ushort *)(local_3a8 + 8);
                  iVar68 = (uint)uVar58 - (int)local_480.fdy;
                  uVar70 = (ulong)(iVar68 + 1);
                  uVar67 = 0;
                  do {
                    uVar90 = local_338;
                    memset(local_288,0,local_338);
                    auVar119 = _DAT_00196690;
                    switch((int)uVar90) {
                    case 2:
                      if (iVar68 < 0) {
LAB_0013cf76:
                        uVar92 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar92 = 0;
                        uVar90 = 0;
                        do {
                          bVar103 = puVar73[uVar92];
                          bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 + 2 & 7)) =
                               bVar103;
                          uVar100 = (int)uVar90 + ((uint)bVar103 - (uint)bVar113);
                          uVar90 = (ulong)uVar100;
                          puVar73[uVar92] = (uchar)(uVar100 >> 1);
                          uVar92 = uVar92 + 1;
                        } while (uVar70 != uVar92);
                      }
                      break;
                    case 3:
                      if (iVar68 < 0) goto LAB_0013cf76;
                      uVar92 = 0;
                      uVar90 = 0;
                      do {
                        bVar103 = puVar73[uVar92];
                        bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 + 3 & 7)) =
                             bVar103;
                        uVar90 = (ulong)((int)uVar90 + ((uint)bVar103 - (uint)bVar113));
                        puVar73[uVar92] = (uchar)(uVar90 / 3);
                        uVar92 = uVar92 + 1;
                      } while (uVar70 != uVar92);
                      break;
                    case 4:
                      if (iVar68 < 0) goto LAB_0013cf76;
                      uVar92 = 0;
                      uVar90 = 0;
                      do {
                        bVar103 = puVar73[uVar92];
                        uVar86 = (ulong)((uint)uVar92 & 7);
                        bVar113 = *(byte *)((long)&local_288[0].data + uVar86);
                        *(byte *)((long)&local_288[0].data + (uVar86 ^ 4)) = bVar103;
                        uVar100 = (int)uVar90 + ((uint)bVar103 - (uint)bVar113);
                        uVar90 = (ulong)uVar100;
                        puVar73[uVar92] = (uchar)(uVar100 >> 2);
                        uVar92 = uVar92 + 1;
                      } while (uVar70 != uVar92);
                      break;
                    case 5:
                      if (iVar68 < 0) goto LAB_0013cf76;
                      uVar92 = 0;
                      uVar90 = 0;
                      do {
                        bVar103 = puVar73[uVar92];
                        bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 + 5 & 7)) =
                             bVar103;
                        uVar90 = (ulong)((int)uVar90 + ((uint)bVar103 - (uint)bVar113));
                        puVar73[uVar92] = (uchar)(uVar90 / 5);
                        uVar92 = uVar92 + 1;
                      } while (uVar70 != uVar92);
                      break;
                    default:
                      uVar92 = 0;
                      uVar90 = 0;
                      if (-1 < iVar68) {
                        do {
                          bVar103 = puVar73[uVar92];
                          bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                          *(byte *)((long)&local_288[0].data +
                                   (ulong)(local_480.fdy + (uint)uVar92 & 7)) = bVar103;
                          uVar90 = (ulong)((int)uVar90 + ((uint)bVar103 - (uint)bVar113));
                          puVar73[uVar92] = (uchar)(uVar90 / (local_480._16_8_ & 0xffffffff));
                          uVar92 = uVar92 + 1;
                        } while (uVar70 != uVar92);
                      }
                    }
                    if ((int)uVar92 < (int)(uint)uVar58) {
                      uVar92 = uVar92 & 0xffffffff;
                      do {
                        uVar90 = (ulong)((int)uVar90 -
                                        (uint)*(byte *)((long)&local_288[0].data +
                                                       (ulong)((uint)uVar92 & 7)));
                        puVar73[uVar92] = (uchar)(uVar90 / (local_480._16_8_ & 0xffffffff));
                        uVar92 = uVar92 + 1;
                      } while ((int)uVar92 < (int)(uint)uVar58);
                    }
                    puVar73 = puVar73 + local_460;
                    uVar67 = uVar67 + 1;
                  } while (uVar67 != uVar117);
                }
              }
              if (1 < (byte)local_340) {
                uVar58 = *(ushort *)(local_3a8 + 4);
                uVar117 = *(ushort *)(local_3a8 + 6);
                local_288[0].data = (uchar *)0x0;
                if (uVar58 != 0) {
                  pbVar88 = local_3b0 +
                            (ulong)*(ushort *)(local_3a8 + 10) * local_460 +
                            (ulong)*(ushort *)(local_3a8 + 8);
                  iVar68 = (uint)uVar117 - (int)local_3d8;
                  uVar70 = (ulong)((uint)uVar117 + (int)local_350 + 1);
                  uVar67 = 0;
                  do {
                    uVar90 = local_340;
                    memset(local_288,0,local_340);
                    auVar119 = _DAT_00196690;
                    switch((int)uVar90) {
                    case 2:
                      if (iVar68 < 0) {
LAB_0013d2b2:
                        uVar92 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar92 = 0;
                        uVar90 = 0;
                        pbVar93 = pbVar88;
                        do {
                          bVar103 = *pbVar93;
                          bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 + 2 & 7)) =
                               bVar103;
                          uVar100 = (int)uVar90 + ((uint)bVar103 - (uint)bVar113);
                          uVar90 = (ulong)uVar100;
                          *pbVar93 = (byte)(uVar100 >> 1);
                          uVar92 = uVar92 + 1;
                          pbVar93 = pbVar93 + local_460;
                        } while (uVar70 != uVar92);
                      }
                      break;
                    case 3:
                      if (iVar68 < 0) goto LAB_0013d2b2;
                      uVar92 = 0;
                      uVar90 = 0;
                      pbVar93 = pbVar88;
                      do {
                        bVar103 = *pbVar93;
                        bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 + 3 & 7)) =
                             bVar103;
                        uVar90 = (ulong)((int)uVar90 + ((uint)bVar103 - (uint)bVar113));
                        *pbVar93 = (byte)(uVar90 / 3);
                        uVar92 = uVar92 + 1;
                        pbVar93 = pbVar93 + local_460;
                      } while (uVar70 != uVar92);
                      break;
                    case 4:
                      if (iVar68 < 0) goto LAB_0013d2b2;
                      uVar92 = 0;
                      uVar90 = 0;
                      pbVar93 = pbVar88;
                      do {
                        bVar103 = *pbVar93;
                        uVar86 = (ulong)((uint)uVar92 & 7);
                        bVar113 = *(byte *)((long)&local_288[0].data + uVar86);
                        *(byte *)((long)&local_288[0].data + (uVar86 ^ 4)) = bVar103;
                        uVar100 = (int)uVar90 + ((uint)bVar103 - (uint)bVar113);
                        uVar90 = (ulong)uVar100;
                        *pbVar93 = (byte)(uVar100 >> 2);
                        uVar92 = uVar92 + 1;
                        pbVar93 = pbVar93 + local_460;
                      } while (uVar70 != uVar92);
                      break;
                    case 5:
                      if (iVar68 < 0) goto LAB_0013d2b2;
                      uVar92 = 0;
                      uVar90 = 0;
                      pbVar93 = pbVar88;
                      do {
                        bVar103 = *pbVar93;
                        bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 + 5 & 7)) =
                             bVar103;
                        uVar90 = (ulong)((int)uVar90 + ((uint)bVar103 - (uint)bVar113));
                        *pbVar93 = (byte)(uVar90 / 5);
                        uVar92 = uVar92 + 1;
                        pbVar93 = pbVar93 + local_460;
                      } while (uVar70 != uVar92);
                      break;
                    default:
                      if (iVar68 < 0) {
                        uVar92 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar92 = 0;
                        uVar90 = 0;
                        pbVar93 = pbVar88;
                        do {
                          bVar103 = *pbVar93;
                          bVar113 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar92 & 7));
                          *(byte *)((long)&local_288[0].data +
                                   (ulong)((int)local_3d8 + (uint)uVar92 & 7)) = bVar103;
                          uVar90 = (ulong)((int)uVar90 + ((uint)bVar103 - (uint)bVar113));
                          *pbVar93 = (byte)(uVar90 / (local_3d8 & 0xffffffff));
                          uVar92 = uVar92 + 1;
                          pbVar93 = pbVar93 + local_460;
                        } while (uVar70 != uVar92);
                      }
                    }
                    if ((int)uVar92 < (int)(uint)uVar117) {
                      uVar92 = (ulong)(int)uVar92;
                      pbVar93 = pbVar88 + local_460 * uVar92;
                      do {
                        uVar90 = (ulong)((int)uVar90 -
                                        (uint)*(byte *)((long)&local_288[0].data +
                                                       (ulong)((uint)uVar92 & 7)));
                        *pbVar93 = (byte)(uVar90 / (local_3d8 & 0xffffffff));
                        uVar92 = uVar92 + 1;
                        pbVar93 = pbVar93 + local_460;
                      } while (uVar117 != uVar92);
                    }
                    pbVar88 = pbVar88 + 1;
                    uVar67 = uVar67 + 1;
                  } while (uVar67 != uVar58);
                }
              }
              local_2f0[4] = (float)(int)(short)((short)(local_380 << 8) + (short)local_384) *
                             local_328;
              *(ulong *)(local_2f0 + 2) =
                   CONCAT44((float)local_374 * (float)local_58._4_4_ + (float)local_48._4_4_,
                            (float)local_370 * (float)local_58._0_4_ + (float)local_48._0_4_);
              uVar150 = *(undefined4 *)(local_3a8 + 8);
              *local_2f0 = uVar150;
              uVar67 = *(uint *)(local_3a8 + 4);
              uVar58 = (ushort)(uVar67 >> 0x10);
              local_2f0[1] = CONCAT22((short)((uint)uVar150 >> 0x10) + uVar58,
                                      (short)uVar150 + (short)uVar67);
              local_2f0[5] = (float)(int)((uVar67 & 0xffff) + local_370) * (float)local_58._0_4_ +
                             (float)local_48._0_4_;
              local_2f0[6] = (float)(int)((uint)uVar58 + local_374) * (float)local_58._4_4_ +
                             (float)local_48._4_4_;
              lVar97 = local_2f8;
              lVar80 = local_2e8;
              psVar87 = local_358;
              auVar121 = _DAT_00194020;
            }
            lVar80 = lVar80 + 1;
          } while (lVar80 < psVar87[1].fontstart);
        }
        fVar118 = local_300[local_360].RasterizerMultiply;
        if ((fVar118 != 1.0) || (NAN(fVar118))) {
          lVar97 = 0;
          uVar67 = 0;
          uVar100 = 1;
          uVar122 = 2;
          uVar123 = 3;
          uVar124 = 4;
          uVar126 = 5;
          uVar127 = 6;
          uVar128 = 7;
          uVar129 = 8;
          uVar130 = 9;
          uVar131 = 10;
          uVar132 = 0xb;
          uVar133 = 0xc;
          uVar135 = 0xd;
          uVar136 = 0xe;
          uVar137 = 0xf;
          do {
            fVar160 = (((float)(uVar129 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar129 & 0xffff | 0x4b000000)) * fVar118;
            fVar165 = (((float)(uVar130 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar130 & 0xffff | 0x4b000000)) * fVar118;
            fVar166 = (((float)(uVar131 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar131 & 0xffff | 0x4b000000)) * fVar118;
            fVar167 = (((float)(uVar132 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar132 & 0xffff | 0x4b000000)) * fVar118;
            fVar149 = (((float)(uVar133 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar133 & 0xffff | 0x4b000000)) * fVar118;
            fVar157 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar135 & 0xffff | 0x4b000000)) * fVar118;
            fVar158 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar118;
            fVar159 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar118;
            fVar143 = (((float)(uVar67 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar67 & 0xffff | 0x4b000000)) * fVar118;
            fVar146 = (((float)(uVar100 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar100 & 0xffff | 0x4b000000)) * fVar118;
            fVar147 = (((float)(uVar122 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar122 & 0xffff | 0x4b000000)) * fVar118;
            fVar148 = (((float)(uVar123 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar123 & 0xffff | 0x4b000000)) * fVar118;
            fVar104 = (((float)(uVar124 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar124 & 0xffff | 0x4b000000)) * fVar118;
            fVar140 = (((float)(uVar126 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar126 & 0xffff | 0x4b000000)) * fVar118;
            fVar141 = (((float)(uVar127 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar127 & 0xffff | 0x4b000000)) * fVar118;
            fVar142 = (((float)(uVar128 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar128 & 0xffff | 0x4b000000)) * fVar118;
            auVar139._0_4_ = (int)fVar104;
            auVar139._4_4_ = (int)fVar140;
            auVar139._8_4_ = (int)fVar141;
            auVar139._12_4_ = (int)fVar142;
            auVar178._0_4_ = auVar139._0_4_ >> 0x1f;
            auVar178._4_4_ = auVar139._4_4_ >> 0x1f;
            auVar178._8_4_ = auVar139._8_4_ >> 0x1f;
            auVar178._12_4_ = auVar139._12_4_ >> 0x1f;
            auVar138._0_4_ = (int)(fVar104 - 2.1474836e+09);
            auVar138._4_4_ = (int)(fVar140 - 2.1474836e+09);
            auVar138._8_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar138._12_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar139 = auVar138 & auVar178 | auVar139;
            auVar145._0_4_ = (int)fVar143;
            auVar145._4_4_ = (int)fVar146;
            auVar145._8_4_ = (int)fVar147;
            auVar145._12_4_ = (int)fVar148;
            auVar179._0_4_ = auVar145._0_4_ >> 0x1f;
            auVar179._4_4_ = auVar145._4_4_ >> 0x1f;
            auVar179._8_4_ = auVar145._8_4_ >> 0x1f;
            auVar179._12_4_ = auVar145._12_4_ >> 0x1f;
            auVar144._0_4_ = (int)(fVar143 - 2.1474836e+09);
            auVar144._4_4_ = (int)(fVar146 - 2.1474836e+09);
            auVar144._8_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar144._12_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar145 = auVar144 & auVar179 | auVar145;
            auVar174._0_4_ = (int)fVar149;
            auVar174._4_4_ = (int)fVar157;
            auVar174._8_4_ = (int)fVar158;
            auVar174._12_4_ = (int)fVar159;
            auVar182._0_4_ = auVar174._0_4_ >> 0x1f;
            auVar182._4_4_ = auVar174._4_4_ >> 0x1f;
            auVar182._8_4_ = auVar174._8_4_ >> 0x1f;
            auVar182._12_4_ = auVar174._12_4_ >> 0x1f;
            auVar173._0_4_ = (int)(fVar149 - 2.1474836e+09);
            auVar173._4_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar173._8_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar173._12_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar174 = auVar173 & auVar182 | auVar174;
            auVar162._0_4_ = (int)fVar160;
            auVar162._4_4_ = (int)fVar165;
            auVar162._8_4_ = (int)fVar166;
            auVar162._12_4_ = (int)fVar167;
            auVar180._0_4_ = auVar162._0_4_ >> 0x1f;
            auVar180._4_4_ = auVar162._4_4_ >> 0x1f;
            auVar180._8_4_ = auVar162._8_4_ >> 0x1f;
            auVar180._12_4_ = auVar162._12_4_ >> 0x1f;
            auVar161._0_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar161._4_4_ = (int)(fVar165 - 2.1474836e+09);
            auVar161._8_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar161._12_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar162 = auVar161 & auVar180 | auVar162;
            auVar121 = auVar162 ^ _DAT_00194020;
            auVar155._0_4_ = -(uint)(auVar121._0_4_ < -0x7fffff01);
            auVar155._4_4_ = -(uint)(auVar121._4_4_ < -0x7fffff01);
            auVar155._8_4_ = -(uint)(auVar121._8_4_ < -0x7fffff01);
            auVar155._12_4_ = -(uint)(auVar121._12_4_ < -0x7fffff01);
            auVar121 = ~auVar155 & auVar119 | auVar162 & auVar155;
            auVar163 = auVar174 ^ _DAT_00194020;
            auVar181._0_4_ = -(uint)(auVar163._0_4_ < -0x7fffff01);
            auVar181._4_4_ = -(uint)(auVar163._4_4_ < -0x7fffff01);
            auVar181._8_4_ = -(uint)(auVar163._8_4_ < -0x7fffff01);
            auVar181._12_4_ = -(uint)(auVar163._12_4_ < -0x7fffff01);
            auVar163 = ~auVar181 & auVar119 | auVar174 & auVar181;
            sVar35 = auVar121._0_2_;
            cVar21 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[0] - (0xff < sVar35);
            sVar35 = auVar121._2_2_;
            sVar59 = CONCAT11((0 < sVar35) * (sVar35 < 0x100) * auVar121[2] - (0xff < sVar35),cVar21
                             );
            sVar35 = auVar121._4_2_;
            cVar114 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[4] - (0xff < sVar35);
            sVar35 = auVar121._6_2_;
            uVar150 = CONCAT13((0 < sVar35) * (sVar35 < 0x100) * auVar121[6] - (0xff < sVar35),
                               CONCAT12(cVar114,sVar59));
            sVar35 = auVar121._8_2_;
            cVar22 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[8] - (0xff < sVar35);
            sVar35 = auVar121._10_2_;
            uVar151 = CONCAT15((0 < sVar35) * (sVar35 < 0x100) * auVar121[10] - (0xff < sVar35),
                               CONCAT14(cVar22,uVar150));
            sVar35 = auVar121._12_2_;
            cVar23 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[0xc] - (0xff < sVar35);
            sVar35 = auVar121._14_2_;
            uVar152 = CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar121[0xe] - (0xff < sVar35),
                               CONCAT16(cVar23,uVar151));
            sVar35 = auVar163._0_2_;
            cVar24 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[0] - (0xff < sVar35);
            sVar35 = auVar163._2_2_;
            auVar153._0_10_ =
                 CONCAT19((0 < sVar35) * (sVar35 < 0x100) * auVar163[2] - (0xff < sVar35),
                          CONCAT18(cVar24,uVar152));
            sVar35 = auVar163._4_2_;
            cVar25 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[4] - (0xff < sVar35);
            auVar153[10] = cVar25;
            sVar35 = auVar163._6_2_;
            auVar153[0xb] = (0 < sVar35) * (sVar35 < 0x100) * auVar163[6] - (0xff < sVar35);
            sVar35 = auVar163._8_2_;
            cVar26 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[8] - (0xff < sVar35);
            auVar154[0xc] = cVar26;
            auVar154._0_12_ = auVar153;
            sVar35 = auVar163._10_2_;
            auVar154[0xd] = (0 < sVar35) * (sVar35 < 0x100) * auVar163[10] - (0xff < sVar35);
            sVar35 = auVar163._12_2_;
            cVar115 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[0xc] - (0xff < sVar35);
            auVar156[0xe] = cVar115;
            auVar156._0_14_ = auVar154;
            sVar35 = auVar163._14_2_;
            auVar156[0xf] = (0 < sVar35) * (sVar35 < 0x100) * auVar163[0xe] - (0xff < sVar35);
            auVar121 = auVar145 ^ _DAT_00194020;
            auVar175._0_4_ = -(uint)(auVar121._0_4_ < -0x7fffff01);
            auVar175._4_4_ = -(uint)(auVar121._4_4_ < -0x7fffff01);
            auVar175._8_4_ = -(uint)(auVar121._8_4_ < -0x7fffff01);
            auVar175._12_4_ = -(uint)(auVar121._12_4_ < -0x7fffff01);
            auVar163 = ~auVar175 & auVar119 | auVar145 & auVar175;
            auVar121 = auVar139 ^ _DAT_00194020;
            auVar164._0_4_ = -(uint)(auVar121._0_4_ < -0x7fffff01);
            auVar164._4_4_ = -(uint)(auVar121._4_4_ < -0x7fffff01);
            auVar164._8_4_ = -(uint)(auVar121._8_4_ < -0x7fffff01);
            auVar164._12_4_ = -(uint)(auVar121._12_4_ < -0x7fffff01);
            auVar121 = ~auVar164 & auVar119 | auVar139 & auVar164;
            sVar35 = auVar163._0_2_;
            cVar27 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[0] - (0xff < sVar35);
            sVar35 = auVar163._2_2_;
            sVar116 = CONCAT11((0 < sVar35) * (sVar35 < 0x100) * auVar163[2] - (0xff < sVar35),
                               cVar27);
            sVar35 = auVar163._4_2_;
            cVar28 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[4] - (0xff < sVar35);
            sVar35 = auVar163._6_2_;
            uVar168 = CONCAT13((0 < sVar35) * (sVar35 < 0x100) * auVar163[6] - (0xff < sVar35),
                               CONCAT12(cVar28,sVar116));
            sVar35 = auVar163._8_2_;
            cVar29 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[8] - (0xff < sVar35);
            sVar35 = auVar163._10_2_;
            uVar169 = CONCAT15((0 < sVar35) * (sVar35 < 0x100) * auVar163[10] - (0xff < sVar35),
                               CONCAT14(cVar29,uVar168));
            sVar35 = auVar163._12_2_;
            cVar30 = (0 < sVar35) * (sVar35 < 0x100) * auVar163[0xc] - (0xff < sVar35);
            sVar35 = auVar163._14_2_;
            uVar170 = CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar163[0xe] - (0xff < sVar35),
                               CONCAT16(cVar30,uVar169));
            sVar35 = auVar121._0_2_;
            cVar31 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[0] - (0xff < sVar35);
            sVar35 = auVar121._2_2_;
            auVar171._0_10_ =
                 CONCAT19((0 < sVar35) * (sVar35 < 0x100) * auVar121[2] - (0xff < sVar35),
                          CONCAT18(cVar31,uVar170));
            sVar35 = auVar121._4_2_;
            cVar32 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[4] - (0xff < sVar35);
            auVar171[10] = cVar32;
            sVar35 = auVar121._6_2_;
            auVar171[0xb] = (0 < sVar35) * (sVar35 < 0x100) * auVar121[6] - (0xff < sVar35);
            sVar35 = auVar121._8_2_;
            cVar33 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[8] - (0xff < sVar35);
            auVar172[0xc] = cVar33;
            auVar172._0_12_ = auVar171;
            sVar35 = auVar121._10_2_;
            auVar172[0xd] = (0 < sVar35) * (sVar35 < 0x100) * auVar121[10] - (0xff < sVar35);
            sVar35 = auVar121._12_2_;
            cVar34 = (0 < sVar35) * (sVar35 < 0x100) * auVar121[0xc] - (0xff < sVar35);
            auVar176[0xe] = cVar34;
            auVar176._0_14_ = auVar172;
            sVar35 = auVar121._14_2_;
            auVar176[0xf] = (0 < sVar35) * (sVar35 < 0x100) * auVar121[0xe] - (0xff < sVar35);
            sVar35 = (short)((uint)uVar168 >> 0x10);
            auVar177[1] = (0 < sVar35) * (sVar35 < 0x100) * cVar28 - (0xff < sVar35);
            auVar177[0] = (0 < sVar116) * (sVar116 < 0x100) * cVar27 - (0xff < sVar116);
            sVar35 = (short)((uint6)uVar169 >> 0x20);
            auVar177[2] = (0 < sVar35) * (sVar35 < 0x100) * cVar29 - (0xff < sVar35);
            sVar35 = (short)((ulong)uVar170 >> 0x30);
            auVar177[3] = (0 < sVar35) * (sVar35 < 0x100) * cVar30 - (0xff < sVar35);
            sVar35 = (short)((unkuint10)auVar171._0_10_ >> 0x40);
            auVar177[4] = (0 < sVar35) * (sVar35 < 0x100) * cVar31 - (0xff < sVar35);
            sVar35 = auVar171._10_2_;
            auVar177[5] = (0 < sVar35) * (sVar35 < 0x100) * cVar32 - (0xff < sVar35);
            sVar35 = auVar172._12_2_;
            auVar177[6] = (0 < sVar35) * (sVar35 < 0x100) * cVar33 - (0xff < sVar35);
            sVar35 = auVar176._14_2_;
            auVar177[7] = (0 < sVar35) * (sVar35 < 0x100) * cVar34 - (0xff < sVar35);
            auVar177[8] = (0 < sVar59) * (sVar59 < 0x100) * cVar21 - (0xff < sVar59);
            sVar35 = (short)((uint)uVar150 >> 0x10);
            auVar177[9] = (0 < sVar35) * (sVar35 < 0x100) * cVar114 - (0xff < sVar35);
            sVar35 = (short)((uint6)uVar151 >> 0x20);
            auVar177[10] = (0 < sVar35) * (sVar35 < 0x100) * cVar22 - (0xff < sVar35);
            sVar35 = (short)((ulong)uVar152 >> 0x30);
            auVar177[0xb] = (0 < sVar35) * (sVar35 < 0x100) * cVar23 - (0xff < sVar35);
            sVar35 = (short)((unkuint10)auVar153._0_10_ >> 0x40);
            auVar177[0xc] = (0 < sVar35) * (sVar35 < 0x100) * cVar24 - (0xff < sVar35);
            sVar35 = auVar153._10_2_;
            auVar177[0xd] = (0 < sVar35) * (sVar35 < 0x100) * cVar25 - (0xff < sVar35);
            sVar35 = auVar154._12_2_;
            auVar177[0xe] = (0 < sVar35) * (sVar35 < 0x100) * cVar26 - (0xff < sVar35);
            sVar35 = auVar156._14_2_;
            auVar177[0xf] = (0 < sVar35) * (sVar35 < 0x100) * cVar115 - (0xff < sVar35);
            *(undefined1 (*) [16])((long)&local_288[0].data + lVar97) = auVar177;
            lVar97 = lVar97 + 0x10;
            uVar67 = uVar67 + 0x10;
            uVar100 = uVar100 + 0x10;
            uVar122 = uVar122 + 0x10;
            uVar123 = uVar123 + 0x10;
            uVar124 = uVar124 + 0x10;
            uVar126 = uVar126 + 0x10;
            uVar127 = uVar127 + 0x10;
            uVar128 = uVar128 + 0x10;
            uVar129 = uVar129 + 0x10;
            uVar130 = uVar130 + 0x10;
            uVar131 = uVar131 + 0x10;
            uVar132 = uVar132 + 0x10;
            uVar133 = uVar133 + 0x10;
            uVar135 = uVar135 + 0x10;
            uVar136 = uVar136 + 0x10;
            uVar137 = uVar137 + 0x10;
          } while (lVar97 != 0x100);
          auVar121 = _DAT_00194020;
          if (0 < psVar87[1].cff.cursor) {
            lVar80._0_4_ = psVar87[1].hmtx;
            lVar80._4_4_ = psVar87[1].kern;
            iVar68 = 0;
            do {
              if ((*(int *)(lVar80 + 0xc) != 0) && (*(ushort *)(lVar80 + 6) != 0)) {
                uVar58 = *(ushort *)(lVar80 + 4);
                iVar98 = atlas->TexWidth;
                puVar73 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar80 + 10) * (long)iVar98 +
                          (ulong)*(ushort *)(lVar80 + 8);
                uVar67 = (uint)*(ushort *)(lVar80 + 6);
                do {
                  if ((ulong)uVar58 != 0) {
                    uVar70 = 0;
                    do {
                      puVar73[uVar70] =
                           *(uchar *)((long)&local_288[0].data + (ulong)puVar73[uVar70]);
                      uVar70 = uVar70 + 1;
                    } while (uVar58 != uVar70);
                  }
                  puVar73 = puVar73 + iVar98;
                  bVar102 = 1 < (int)uVar67;
                  uVar67 = uVar67 - 1;
                } while (bVar102);
              }
              iVar68 = iVar68 + 1;
              lVar80 = lVar80 + 0x10;
            } while (iVar68 < psVar87[1].cff.cursor);
          }
        }
        psVar87[1].hmtx = 0;
        psVar87[1].kern = 0;
      }
      lVar97 = local_360 + 1;
    } while (lVar97 < iVar185);
  }
  ImGui::MemFree(local_408);
  ImGui::MemFree(local_368);
  uVar152 = local_458._8_8_;
  if ((void *)local_458._8_8_ != (void *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_458._8_8_;
    local_458 = auVar42 << 0x40;
    ImGui::MemFree((void *)uVar152);
    local_458._8_8_ = 0;
  }
  if (0 < iVar185) {
    lVar97 = 0;
    auVar112._0_12_ = DAT_001965e0._0_12_;
    auVar112._12_2_ = DAT_001965e0._6_2_;
    auVar112._14_2_ = DAT_001965e0._6_2_;
    auVar111._12_4_ = auVar112._12_4_;
    auVar111._0_10_ = (unkbyte10)DAT_001965e0;
    auVar111._10_2_ = DAT_001965e0._4_2_;
    auVar110._10_6_ = auVar111._10_6_;
    auVar110._0_8_ = (undefined8)DAT_001965e0;
    auVar110._8_2_ = DAT_001965e0._4_2_;
    local_448._8_8_ = auVar110._8_8_;
    local_448._6_2_ = DAT_001965e0._2_2_;
    local_448._4_2_ = DAT_001965e0._2_2_;
    local_448._0_2_ = (undefined2)DAT_001965e0;
    local_448._2_2_ = local_448._0_2_;
    pvVar69 = __dest;
    do {
      lVar80 = lVar97 * 0x110;
      __dest = pvVar69;
      if (*(int *)((long)pvVar69 + lVar80 + 0xe8) != 0) {
        pIVar19 = (atlas->ConfigData).Data;
        pIVar94 = pIVar19 + lVar97;
        pIVar15 = pIVar19[lVar97].DstFont;
        if (pIVar19[lVar97].MergeMode == false) {
          fVar118 = pIVar19[lVar97].SizePixels;
          lVar101 = *(long *)((long)pvVar69 + lVar80 + 8);
          lVar85 = (long)*(int *)((long)pvVar69 + lVar80 + 0x24);
          bVar103 = *(byte *)(lVar101 + 4 + lVar85);
          bVar113 = *(byte *)(lVar101 + 5 + lVar85);
          bVar12 = *(byte *)(lVar101 + 7 + lVar85);
          bVar13 = *(byte *)(lVar101 + 6 + lVar85);
          ImFont::ClearOutputData(pIVar15);
          iVar68 = (uint)bVar13 * 0x100 + (uint)bVar103;
          auVar37._1_9_ = (unkuint9)0 << 8;
          auVar37[0] = (char)((uint)iVar68 >> 0x10);
          auVar37._10_6_ = 0;
          auVar46._1_12_ = SUB1612(auVar37 << 0x28,4);
          auVar46[0] = (char)((uint)iVar68 >> 8);
          auVar46[0xd] = 0;
          auVar49._1_14_ = auVar46 << 8;
          auVar49[0] = (char)iVar68;
          auVar49[0xf] = 0;
          auVar119 = ZEXT416((uint)bVar113 | (uint)bVar12 << 0x10) | auVar49 << 8;
          sVar59 = auVar119._0_2_;
          sVar35 = auVar119._2_2_;
          fVar104 = (float)((int)sVar59 - (int)sVar35);
          fVar118 = fVar118 / fVar104;
          sVar116 = auVar119._4_2_;
          auVar56._4_6_ = 0;
          auVar56._0_4_ = fVar104;
          auVar56._10_2_ = sVar116;
          auVar57._8_4_ = auVar56._8_4_;
          auVar57._6_2_ = sVar35;
          auVar57._4_2_ = (short)((uint)fVar104 >> 0x10);
          auVar57._0_4_ = fVar104;
          auVar125._0_2_ = -(ushort)(sVar59 < (short)local_448._0_2_);
          auVar125._2_2_ = -(ushort)(sVar59 < (short)local_448._2_2_);
          auVar125._4_2_ = -(ushort)(sVar35 < (short)local_448._4_2_);
          auVar125._6_2_ = -(ushort)(sVar35 < (short)local_448._6_2_);
          auVar125._8_2_ = -(ushort)(sVar116 < (short)local_448._8_2_);
          auVar125._10_2_ = -(ushort)(sVar116 < (short)local_448._10_2_);
          auVar125._12_2_ = -(ushort)(0 < (short)local_448._12_2_);
          auVar125._14_2_ = -(ushort)(0 < (short)local_448._14_2_);
          auVar119 = auVar125 & _DAT_00194e30 | ~auVar125 & _DAT_00194dc0;
          pIVar15->FontSize = pIVar94->SizePixels;
          pIVar15->ConfigData = pIVar94;
          pIVar15->ContainerAtlas = atlas;
          pIVar15->Ascent = (float)(int)(fVar118 * (float)(int)sVar59 + auVar119._0_4_);
          pIVar15->Descent = (float)(int)(fVar118 * (float)(auVar57._4_4_ >> 0x10) + auVar119._4_4_)
          ;
        }
        pIVar15->ConfigDataCount = pIVar15->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvVar69 + lVar80 + 0xe8)) {
          fVar118 = (pIVar94->GlyphOffset).x;
          fVar104 = (float)(int)(pIVar15->Ascent + 0.5) + (pIVar94->GlyphOffset).y;
          lVar85 = 0;
          lVar101 = 0;
          do {
            lVar20 = *(long *)((long)pvVar69 + lVar80 + 0xd0);
            fVar140 = *(float *)(lVar20 + 0x10 + lVar85);
            fVar141 = pIVar94->GlyphMaxAdvanceX;
            if (fVar140 <= pIVar94->GlyphMaxAdvanceX) {
              fVar141 = fVar140;
            }
            uVar67 = -(uint)(fVar140 < pIVar94->GlyphMinAdvanceX);
            fVar141 = (float)(uVar67 & (uint)pIVar94->GlyphMinAdvanceX | ~uVar67 & (uint)fVar141);
            if ((fVar140 != fVar141) || (fVar142 = fVar118, NAN(fVar140) || NAN(fVar141))) {
              fVar142 = (fVar141 - fVar140) * 0.5;
              if (pIVar94->PixelSnapH != false) {
                fVar142 = (float)(int)fVar142;
              }
              fVar142 = fVar142 + fVar118;
            }
            fVar143 = 1.0 / (float)atlas->TexHeight;
            fVar140 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar15,(ImWchar)*(undefined4 *)
                                               (*(long *)((long)pvVar69 + lVar80 + 0x108) +
                                               lVar101 * 4),
                             *(float *)(lVar20 + 8 + lVar85) + 0.0 + fVar142,
                             *(float *)(lVar20 + 0xc + lVar85) + 0.0 + fVar104,
                             *(float *)(lVar20 + 0x14 + lVar85) + 0.0 + fVar142,
                             *(float *)(lVar20 + 0x18 + lVar85) + 0.0 + fVar104,
                             (float)*(ushort *)(lVar20 + lVar85) * fVar140,
                             (float)*(ushort *)(lVar20 + 2 + lVar85) * fVar143,
                             (float)*(ushort *)(lVar20 + 4 + lVar85) * fVar140,
                             (float)*(ushort *)(lVar20 + 6 + lVar85) * fVar143,fVar141);
            lVar101 = lVar101 + 1;
            lVar85 = lVar85 + 0x1c;
          } while (lVar101 < *(int *)((long)pvVar69 + lVar80 + 0xe8));
        }
      }
      lVar97 = lVar97 + 1;
      pvVar69 = __dest;
    } while (lVar97 < iVar185);
  }
  if (0 < iVar185) {
    lVar97 = 0x108;
    lVar80 = 0;
    pvVar69 = __dest;
    do {
      __dest = pvVar69;
      if (*(void **)((long)pvVar69 + lVar97) != (void *)0x0) {
        ImGui::MemFree(*(void **)((long)pvVar69 + lVar97));
      }
      pvVar69 = *(void **)((long)pvVar69 + lVar97 + -0x10);
      if (pvVar69 != (void *)0x0) {
        ImGui::MemFree(pvVar69);
      }
      lVar80 = lVar80 + 1;
      lVar97 = lVar97 + 0x110;
      pvVar69 = __dest;
    } while (lVar80 < iVar185);
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_410 != (void *)0x0) {
    ImGui::MemFree(pvStack_410);
  }
  if ((void *)local_458._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_458._8_8_);
  }
LAB_0013db93:
  bVar103 = (byte)((uint)iVar184 >> 0x18);
  if (pvStack_430 != (void *)0x0) {
    ImGui::MemFree(pvStack_430);
  }
  if (__dest != (void *)0x0) {
    ImGui::MemFree(__dest);
  }
  return (bool)(bVar103 & 1);
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.GlyphsSet.Resize(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.SrcCount > 1 && dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Resize(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (cfg.MergeMode && dst_tmp.GlyphsSet.GetBit(codepoint))   // Don't overwrite existing glyphs. We could make this an option (e.g. MergeOverwrite)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;
                
                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint, true);
                if (dst_tmp.SrcCount > 1)
                    dst_tmp.GlyphsSet.SetBit(codepoint, true);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBoolVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096*0.7f) ? 4096 : (surface_sqrt >= 2048*0.7f) ? 2048 : (surface_sqrt >= 1024*0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? (float)(int)((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;
            
            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}